

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [12];
  int iVar56;
  int iVar57;
  int iVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  byte bVar69;
  byte bVar70;
  byte bVar71;
  ulong uVar72;
  uint uVar73;
  byte bVar74;
  ulong uVar75;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  uint uVar76;
  long lVar77;
  bool bVar78;
  ulong uVar79;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar136 [32];
  uint uVar143;
  float pp;
  float fVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar165;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar166;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  float fVar206;
  float fVar207;
  undefined4 uVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  float fVar228;
  float fVar229;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar230;
  float fVar232;
  undefined1 auVar226 [16];
  float fVar231;
  float fVar233;
  float fVar234;
  undefined1 auVar227 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [16];
  float fVar238;
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_920 [16];
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  ulong local_8c0;
  uint local_8b4;
  uint local_8b0;
  undefined4 local_8ac;
  float local_8a8;
  float local_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  RTCFilterFunctionNArguments local_860;
  undefined1 local_830 [16];
  Primitive *local_820;
  ulong local_818;
  ulong local_810;
  ulong local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  float local_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  RTCHitN local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [16];
  undefined8 local_590;
  undefined8 uStack_588;
  undefined1 local_580 [16];
  uint local_570;
  uint uStack_56c;
  uint uStack_568;
  uint uStack_564;
  uint uStack_560;
  uint uStack_55c;
  uint uStack_558;
  uint uStack_554;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar132 [32];
  undefined1 auVar135 [32];
  
  PVar1 = prim[1];
  uVar72 = (ulong)(byte)PVar1;
  fVar207 = *(float *)(prim + uVar72 * 0x19 + 0x12);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar90 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar89 = vsubps_avx(auVar82,*(undefined1 (*) [16])(prim + uVar72 * 0x19 + 6));
  fVar206 = fVar207 * auVar89._0_4_;
  fVar144 = fVar207 * auVar90._0_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar72 * 4 + 6);
  auVar96 = vpmovsxbd_avx2(auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar72 * 5 + 6);
  auVar94 = vpmovsxbd_avx2(auVar83);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar72 * 6 + 6);
  auVar97 = vpmovsxbd_avx2(auVar84);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar72 * 0xb + 6);
  auVar98 = vpmovsxbd_avx2(auVar85);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar103 = vpmovsxbd_avx2(auVar80);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar99 = vcvtdq2ps_avx(auVar103);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar72 + 6);
  auVar95 = vpmovsxbd_avx2(auVar87);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar79 = (ulong)(uint)((int)(uVar72 * 9) * 2);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar79 + 6);
  auVar100 = vpmovsxbd_avx2(auVar86);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar79 + uVar72 + 6);
  auVar101 = vpmovsxbd_avx2(auVar81);
  auVar101 = vcvtdq2ps_avx(auVar101);
  uVar75 = (ulong)(uint)((int)(uVar72 * 5) << 2);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar75 + 6);
  auVar93 = vpmovsxbd_avx2(auVar88);
  auVar102 = vcvtdq2ps_avx(auVar93);
  auVar113._4_4_ = fVar144;
  auVar113._0_4_ = fVar144;
  auVar113._8_4_ = fVar144;
  auVar113._12_4_ = fVar144;
  auVar113._16_4_ = fVar144;
  auVar113._20_4_ = fVar144;
  auVar113._24_4_ = fVar144;
  auVar113._28_4_ = fVar144;
  auVar115._8_4_ = 1;
  auVar115._0_8_ = 0x100000001;
  auVar115._12_4_ = 1;
  auVar115._16_4_ = 1;
  auVar115._20_4_ = 1;
  auVar115._24_4_ = 1;
  auVar115._28_4_ = 1;
  auVar91 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar105 = ZEXT1632(CONCAT412(fVar207 * auVar90._12_4_,
                                CONCAT48(fVar207 * auVar90._8_4_,
                                         CONCAT44(fVar207 * auVar90._4_4_,fVar144))));
  auVar104 = vpermps_avx2(auVar115,auVar105);
  auVar92 = vpermps_avx512vl(auVar91,auVar105);
  fVar144 = auVar92._0_4_;
  fVar228 = auVar92._4_4_;
  auVar105._4_4_ = fVar228 * auVar97._4_4_;
  auVar105._0_4_ = fVar144 * auVar97._0_4_;
  fVar229 = auVar92._8_4_;
  auVar105._8_4_ = fVar229 * auVar97._8_4_;
  fVar231 = auVar92._12_4_;
  auVar105._12_4_ = fVar231 * auVar97._12_4_;
  fVar238 = auVar92._16_4_;
  auVar105._16_4_ = fVar238 * auVar97._16_4_;
  fVar165 = auVar92._20_4_;
  auVar105._20_4_ = fVar165 * auVar97._20_4_;
  fVar233 = auVar92._24_4_;
  auVar105._24_4_ = fVar233 * auVar97._24_4_;
  auVar105._28_4_ = auVar103._28_4_;
  auVar103._4_4_ = auVar95._4_4_ * fVar228;
  auVar103._0_4_ = auVar95._0_4_ * fVar144;
  auVar103._8_4_ = auVar95._8_4_ * fVar229;
  auVar103._12_4_ = auVar95._12_4_ * fVar231;
  auVar103._16_4_ = auVar95._16_4_ * fVar238;
  auVar103._20_4_ = auVar95._20_4_ * fVar165;
  auVar103._24_4_ = auVar95._24_4_ * fVar233;
  auVar103._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar102._4_4_ * fVar228;
  auVar93._0_4_ = auVar102._0_4_ * fVar144;
  auVar93._8_4_ = auVar102._8_4_ * fVar229;
  auVar93._12_4_ = auVar102._12_4_ * fVar231;
  auVar93._16_4_ = auVar102._16_4_ * fVar238;
  auVar93._20_4_ = auVar102._20_4_ * fVar165;
  auVar93._24_4_ = auVar102._24_4_ * fVar233;
  auVar93._28_4_ = auVar92._28_4_;
  auVar82 = vfmadd231ps_fma(auVar105,auVar104,auVar94);
  auVar83 = vfmadd231ps_fma(auVar103,auVar104,auVar99);
  auVar84 = vfmadd231ps_fma(auVar93,auVar101,auVar104);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar113,auVar96);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar113,auVar98);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar100,auVar113);
  auVar114._4_4_ = fVar206;
  auVar114._0_4_ = fVar206;
  auVar114._8_4_ = fVar206;
  auVar114._12_4_ = fVar206;
  auVar114._16_4_ = fVar206;
  auVar114._20_4_ = fVar206;
  auVar114._24_4_ = fVar206;
  auVar114._28_4_ = fVar206;
  auVar93 = ZEXT1632(CONCAT412(fVar207 * auVar89._12_4_,
                               CONCAT48(fVar207 * auVar89._8_4_,
                                        CONCAT44(fVar207 * auVar89._4_4_,fVar206))));
  auVar103 = vpermps_avx2(auVar115,auVar93);
  auVar93 = vpermps_avx512vl(auVar91,auVar93);
  fVar207 = auVar93._0_4_;
  fVar144 = auVar93._4_4_;
  auVar104._4_4_ = fVar144 * auVar97._4_4_;
  auVar104._0_4_ = fVar207 * auVar97._0_4_;
  fVar228 = auVar93._8_4_;
  auVar104._8_4_ = fVar228 * auVar97._8_4_;
  fVar229 = auVar93._12_4_;
  auVar104._12_4_ = fVar229 * auVar97._12_4_;
  fVar231 = auVar93._16_4_;
  auVar104._16_4_ = fVar231 * auVar97._16_4_;
  fVar238 = auVar93._20_4_;
  auVar104._20_4_ = fVar238 * auVar97._20_4_;
  fVar165 = auVar93._24_4_;
  auVar104._24_4_ = fVar165 * auVar97._24_4_;
  auVar104._28_4_ = 1;
  auVar91._4_4_ = auVar95._4_4_ * fVar144;
  auVar91._0_4_ = auVar95._0_4_ * fVar207;
  auVar91._8_4_ = auVar95._8_4_ * fVar228;
  auVar91._12_4_ = auVar95._12_4_ * fVar229;
  auVar91._16_4_ = auVar95._16_4_ * fVar231;
  auVar91._20_4_ = auVar95._20_4_ * fVar238;
  auVar91._24_4_ = auVar95._24_4_ * fVar165;
  auVar91._28_4_ = auVar97._28_4_;
  auVar95._4_4_ = auVar102._4_4_ * fVar144;
  auVar95._0_4_ = auVar102._0_4_ * fVar207;
  auVar95._8_4_ = auVar102._8_4_ * fVar228;
  auVar95._12_4_ = auVar102._12_4_ * fVar229;
  auVar95._16_4_ = auVar102._16_4_ * fVar231;
  auVar95._20_4_ = auVar102._20_4_ * fVar238;
  auVar95._24_4_ = auVar102._24_4_ * fVar165;
  auVar95._28_4_ = auVar93._28_4_;
  auVar85 = vfmadd231ps_fma(auVar104,auVar103,auVar94);
  auVar80 = vfmadd231ps_fma(auVar91,auVar103,auVar99);
  auVar87 = vfmadd231ps_fma(auVar95,auVar103,auVar101);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar114,auVar96);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar114,auVar98);
  auVar110._8_4_ = 0x7fffffff;
  auVar110._0_8_ = 0x7fffffff7fffffff;
  auVar110._12_4_ = 0x7fffffff;
  auVar110._16_4_ = 0x7fffffff;
  auVar110._20_4_ = 0x7fffffff;
  auVar110._24_4_ = 0x7fffffff;
  auVar110._28_4_ = 0x7fffffff;
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar114,auVar100);
  auVar96 = vandps_avx(ZEXT1632(auVar82),auVar110);
  auVar112._8_4_ = 0x219392ef;
  auVar112._0_8_ = 0x219392ef219392ef;
  auVar112._12_4_ = 0x219392ef;
  auVar112._16_4_ = 0x219392ef;
  auVar112._20_4_ = 0x219392ef;
  auVar112._24_4_ = 0x219392ef;
  auVar112._28_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar96,auVar112,1);
  bVar5 = (bool)((byte)uVar79 & 1);
  auVar92._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar82._0_4_;
  bVar5 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar82._4_4_;
  bVar5 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar82._8_4_;
  bVar5 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar82._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar83),auVar110);
  uVar79 = vcmpps_avx512vl(auVar96,auVar112,1);
  bVar5 = (bool)((byte)uVar79 & 1);
  auVar106._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar83._0_4_;
  bVar5 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar106._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar83._4_4_;
  bVar5 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar106._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar83._8_4_;
  bVar5 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar106._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar83._12_4_;
  auVar106._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar106._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar106._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar106._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar84),auVar110);
  uVar79 = vcmpps_avx512vl(auVar96,auVar112,1);
  bVar5 = (bool)((byte)uVar79 & 1);
  auVar96._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar84._0_4_;
  bVar5 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar84._4_4_;
  bVar5 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar84._8_4_;
  bVar5 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar84._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar94 = vrcp14ps_avx512vl(auVar92);
  auVar111._8_4_ = 0x3f800000;
  auVar111._0_8_ = &DAT_3f8000003f800000;
  auVar111._12_4_ = 0x3f800000;
  auVar111._16_4_ = 0x3f800000;
  auVar111._20_4_ = 0x3f800000;
  auVar111._24_4_ = 0x3f800000;
  auVar111._28_4_ = 0x3f800000;
  auVar82 = vfnmadd213ps_fma(auVar92,auVar94,auVar111);
  auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar106);
  auVar83 = vfnmadd213ps_fma(auVar106,auVar94,auVar111);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar96);
  auVar84 = vfnmadd213ps_fma(auVar96,auVar94,auVar111);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar94,auVar94);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 7 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar85));
  auVar100._4_4_ = auVar82._4_4_ * auVar96._4_4_;
  auVar100._0_4_ = auVar82._0_4_ * auVar96._0_4_;
  auVar100._8_4_ = auVar82._8_4_ * auVar96._8_4_;
  auVar100._12_4_ = auVar82._12_4_ * auVar96._12_4_;
  auVar100._16_4_ = auVar96._16_4_ * 0.0;
  auVar100._20_4_ = auVar96._20_4_ * 0.0;
  auVar100._24_4_ = auVar96._24_4_ * 0.0;
  auVar100._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 9 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar85));
  auVar95 = vpbroadcastd_avx512vl();
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar109._0_4_ = auVar82._0_4_ * auVar96._0_4_;
  auVar109._4_4_ = auVar82._4_4_ * auVar96._4_4_;
  auVar109._8_4_ = auVar82._8_4_ * auVar96._8_4_;
  auVar109._12_4_ = auVar82._12_4_ * auVar96._12_4_;
  auVar109._16_4_ = auVar96._16_4_ * 0.0;
  auVar109._20_4_ = auVar96._20_4_ * 0.0;
  auVar109._24_4_ = auVar96._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar1 * 0x10 + uVar72 * -2 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar80));
  auVar101._4_4_ = auVar83._4_4_ * auVar96._4_4_;
  auVar101._0_4_ = auVar83._0_4_ * auVar96._0_4_;
  auVar101._8_4_ = auVar83._8_4_ * auVar96._8_4_;
  auVar101._12_4_ = auVar83._12_4_ * auVar96._12_4_;
  auVar101._16_4_ = auVar96._16_4_ * 0.0;
  auVar101._20_4_ = auVar96._20_4_ * 0.0;
  auVar101._24_4_ = auVar96._24_4_ * 0.0;
  auVar101._28_4_ = auVar96._28_4_;
  auVar96 = vcvtdq2ps_avx(auVar94);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar80));
  auVar108._0_4_ = auVar83._0_4_ * auVar96._0_4_;
  auVar108._4_4_ = auVar83._4_4_ * auVar96._4_4_;
  auVar108._8_4_ = auVar83._8_4_ * auVar96._8_4_;
  auVar108._12_4_ = auVar83._12_4_ * auVar96._12_4_;
  auVar108._16_4_ = auVar96._16_4_ * 0.0;
  auVar108._20_4_ = auVar96._20_4_ * 0.0;
  auVar108._24_4_ = auVar96._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 + uVar72 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar87));
  auVar102._4_4_ = auVar96._4_4_ * auVar84._4_4_;
  auVar102._0_4_ = auVar96._0_4_ * auVar84._0_4_;
  auVar102._8_4_ = auVar96._8_4_ * auVar84._8_4_;
  auVar102._12_4_ = auVar96._12_4_ * auVar84._12_4_;
  auVar102._16_4_ = auVar96._16_4_ * 0.0;
  auVar102._20_4_ = auVar96._20_4_ * 0.0;
  auVar102._24_4_ = auVar96._24_4_ * 0.0;
  auVar102._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x17 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar87));
  auVar107._0_4_ = auVar84._0_4_ * auVar96._0_4_;
  auVar107._4_4_ = auVar84._4_4_ * auVar96._4_4_;
  auVar107._8_4_ = auVar84._8_4_ * auVar96._8_4_;
  auVar107._12_4_ = auVar84._12_4_ * auVar96._12_4_;
  auVar107._16_4_ = auVar96._16_4_ * 0.0;
  auVar107._20_4_ = auVar96._20_4_ * 0.0;
  auVar107._24_4_ = auVar96._24_4_ * 0.0;
  auVar107._28_4_ = 0;
  auVar96 = vpminsd_avx2(auVar100,auVar109);
  auVar94 = vpminsd_avx2(auVar101,auVar108);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94 = vpminsd_avx2(auVar102,auVar107);
  uVar208 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar97._4_4_ = uVar208;
  auVar97._0_4_ = uVar208;
  auVar97._8_4_ = uVar208;
  auVar97._12_4_ = uVar208;
  auVar97._16_4_ = uVar208;
  auVar97._20_4_ = uVar208;
  auVar97._24_4_ = uVar208;
  auVar97._28_4_ = uVar208;
  auVar94 = vmaxps_avx512vl(auVar94,auVar97);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94._8_4_ = 0x3f7ffffa;
  auVar94._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar94._12_4_ = 0x3f7ffffa;
  auVar94._16_4_ = 0x3f7ffffa;
  auVar94._20_4_ = 0x3f7ffffa;
  auVar94._24_4_ = 0x3f7ffffa;
  auVar94._28_4_ = 0x3f7ffffa;
  local_420 = vmulps_avx512vl(auVar96,auVar94);
  auVar96 = vpmaxsd_avx2(auVar100,auVar109);
  auVar94 = vpmaxsd_avx2(auVar101,auVar108);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar94 = vpmaxsd_avx2(auVar102,auVar107);
  uVar208 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar98._4_4_ = uVar208;
  auVar98._0_4_ = uVar208;
  auVar98._8_4_ = uVar208;
  auVar98._12_4_ = uVar208;
  auVar98._16_4_ = uVar208;
  auVar98._20_4_ = uVar208;
  auVar98._24_4_ = uVar208;
  auVar98._28_4_ = uVar208;
  auVar94 = vminps_avx512vl(auVar94,auVar98);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar99._16_4_ = 0x3f800003;
  auVar99._20_4_ = 0x3f800003;
  auVar99._24_4_ = 0x3f800003;
  auVar99._28_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar99);
  uVar14 = vpcmpgtd_avx512vl(auVar95,_DAT_0205a920);
  uVar13 = vcmpps_avx512vl(local_420,auVar96,2);
  if ((byte)((byte)uVar13 & (byte)uVar14) == 0) {
    return;
  }
  local_808 = (ulong)(byte)((byte)uVar13 & (byte)uVar14);
  local_610 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_820 = prim;
LAB_01de1f99:
  lVar77 = 0;
  for (uVar79 = local_808; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    lVar77 = lVar77 + 1;
  }
  uVar76 = *(uint *)(prim + 2);
  local_8c0 = (ulong)*(uint *)(prim + lVar77 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar76].ptr;
  uVar79 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8c0);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar77 = *(long *)&pGVar3[1].time_range.upper;
  auVar82 = *(undefined1 (*) [16])(lVar77 + (long)p_Var4 * uVar79);
  auVar83 = *(undefined1 (*) [16])(lVar77 + (uVar79 + 1) * (long)p_Var4);
  auVar84 = *(undefined1 (*) [16])(lVar77 + (uVar79 + 2) * (long)p_Var4);
  local_808 = local_808 - 1 & local_808;
  auVar85 = *(undefined1 (*) [16])(lVar77 + (uVar79 + 3) * (long)p_Var4);
  if (local_808 != 0) {
    uVar75 = local_808 - 1 & local_808;
    for (uVar79 = local_808; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    }
    if (uVar75 != 0) {
      for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar87 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_880 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  auVar245 = ZEXT3264(local_880);
  local_8a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar246 = ZEXT3264(local_8a0);
  auVar80 = vunpcklps_avx512vl(local_880._0_16_,local_8a0._0_16_);
  local_800 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar244 = ZEXT3264(local_800);
  auVar88 = local_800._0_16_;
  local_780 = vinsertps_avx512f(auVar80,auVar88,0x28);
  auVar89._0_4_ = auVar82._0_4_ + auVar83._0_4_ + auVar84._0_4_ + auVar85._0_4_;
  auVar89._4_4_ = auVar82._4_4_ + auVar83._4_4_ + auVar84._4_4_ + auVar85._4_4_;
  auVar89._8_4_ = auVar82._8_4_ + auVar83._8_4_ + auVar84._8_4_ + auVar85._8_4_;
  auVar89._12_4_ = auVar82._12_4_ + auVar83._12_4_ + auVar84._12_4_ + auVar85._12_4_;
  auVar90._8_4_ = 0x3e800000;
  auVar90._0_8_ = 0x3e8000003e800000;
  auVar90._12_4_ = 0x3e800000;
  auVar80 = vmulps_avx512vl(auVar89,auVar90);
  auVar80 = vsubps_avx(auVar80,auVar87);
  auVar80 = vdpps_avx(auVar80,local_780,0x7f);
  fVar207 = *(float *)(ray + k * 4 + 0x30);
  local_790 = vdpps_avx(local_780,local_780,0x7f);
  auVar223._4_12_ = ZEXT812(0) << 0x20;
  auVar223._0_4_ = local_790._0_4_;
  auVar81 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar223);
  auVar86 = vfnmadd213ss_fma(auVar81,local_790,ZEXT416(0x40000000));
  local_400 = auVar80._0_4_ * auVar81._0_4_ * auVar86._0_4_;
  auVar224._4_4_ = local_400;
  auVar224._0_4_ = local_400;
  auVar224._8_4_ = local_400;
  auVar224._12_4_ = local_400;
  fStack_650 = local_400;
  _local_660 = auVar224;
  fStack_64c = local_400;
  fStack_648 = local_400;
  fStack_644 = local_400;
  auVar80 = vfmadd231ps_fma(auVar87,local_780,auVar224);
  auVar80 = vblendps_avx(auVar80,ZEXT816(0) << 0x40,8);
  auVar82 = vsubps_avx(auVar82,auVar80);
  auVar84 = vsubps_avx(auVar84,auVar80);
  auVar83 = vsubps_avx(auVar83,auVar80);
  auVar85 = vsubps_avx(auVar85,auVar80);
  local_1e0 = auVar82._0_4_;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  auVar117._8_4_ = 1;
  auVar117._0_8_ = 0x100000001;
  auVar117._12_4_ = 1;
  auVar117._16_4_ = 1;
  auVar117._20_4_ = 1;
  auVar117._24_4_ = 1;
  auVar117._28_4_ = 1;
  local_6a0 = ZEXT1632(auVar82);
  local_200 = vpermps_avx2(auVar117,local_6a0);
  auVar120._8_4_ = 2;
  auVar120._0_8_ = 0x200000002;
  auVar120._12_4_ = 2;
  auVar120._16_4_ = 2;
  auVar120._20_4_ = 2;
  auVar120._24_4_ = 2;
  auVar120._28_4_ = 2;
  local_220 = vpermps_avx2(auVar120,local_6a0);
  auVar121._8_4_ = 3;
  auVar121._0_8_ = 0x300000003;
  auVar121._12_4_ = 3;
  auVar121._16_4_ = 3;
  auVar121._20_4_ = 3;
  auVar121._24_4_ = 3;
  auVar121._28_4_ = 3;
  local_240 = vpermps_avx2(auVar121,local_6a0);
  local_260 = auVar83._0_4_;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_6e0 = ZEXT1632(auVar83);
  local_280 = vpermps_avx2(auVar117,local_6e0);
  local_2a0 = vpermps_avx2(auVar120,local_6e0);
  local_2c0 = vpermps_avx2(auVar121,local_6e0);
  local_2e0 = auVar84._0_4_;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_6c0 = ZEXT1632(auVar84);
  local_300 = vpermps_avx2(auVar117,local_6c0);
  local_320 = vpermps_avx2(auVar120,local_6c0);
  local_340 = vpermps_avx2(auVar121,local_6c0);
  uVar208 = auVar85._0_4_;
  local_360._4_4_ = uVar208;
  local_360._0_4_ = uVar208;
  fStack_358 = (float)uVar208;
  fStack_354 = (float)uVar208;
  fStack_350 = (float)uVar208;
  fStack_34c = (float)uVar208;
  fStack_348 = (float)uVar208;
  register0x0000131c = uVar208;
  auVar219 = ZEXT3264(_local_360);
  _local_700 = ZEXT1632(auVar85);
  _local_380 = vpermps_avx2(auVar117,_local_700);
  _local_3a0 = vpermps_avx2(auVar120,_local_700);
  _local_3c0 = vpermps_avx2(auVar121,_local_700);
  auVar82 = vmulss_avx512f(auVar88,auVar88);
  auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),local_8a0,local_8a0);
  local_4a0 = vfmadd231ps_avx512vl(auVar96,local_880,local_880);
  local_3e0._0_4_ = local_4a0._0_4_;
  local_3e0._4_4_ = local_3e0._0_4_;
  local_3e0._8_4_ = local_3e0._0_4_;
  local_3e0._12_4_ = local_3e0._0_4_;
  local_3e0._16_4_ = local_3e0._0_4_;
  local_3e0._20_4_ = local_3e0._0_4_;
  local_3e0._24_4_ = local_3e0._0_4_;
  local_3e0._28_4_ = local_3e0._0_4_;
  auVar116._8_4_ = 0x7fffffff;
  auVar116._0_8_ = 0x7fffffff7fffffff;
  auVar116._12_4_ = 0x7fffffff;
  auVar116._16_4_ = 0x7fffffff;
  auVar116._20_4_ = 0x7fffffff;
  auVar116._24_4_ = 0x7fffffff;
  auVar116._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_3e0,auVar116);
  local_760 = ZEXT416((uint)local_400);
  local_400 = fVar207 - local_400;
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_5f0 = vpbroadcastd_avx512vl();
  local_818 = 1;
  local_810 = 0;
  local_600 = vpbroadcastd_avx512vl();
  auVar82 = vsqrtss_avx(local_790,local_790);
  local_8a4 = auVar82._0_4_;
  auVar82 = vsqrtss_avx(local_790,local_790);
  local_8a8 = auVar82._0_4_;
  auVar204 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar212 = ZEXT3264(_DAT_02020f20);
  do {
    local_830 = auVar204._0_16_;
    auVar82 = vmovshdup_avx(local_830);
    fVar144 = auVar204._0_4_;
    fVar165 = auVar82._0_4_ - fVar144;
    fVar238 = fVar165 * 0.04761905;
    auVar222._4_4_ = fVar144;
    auVar222._0_4_ = fVar144;
    auVar222._8_4_ = fVar144;
    auVar222._12_4_ = fVar144;
    auVar222._16_4_ = fVar144;
    auVar222._20_4_ = fVar144;
    auVar222._24_4_ = fVar144;
    auVar222._28_4_ = fVar144;
    local_7c0._4_4_ = fVar165;
    local_7c0._0_4_ = fVar165;
    local_7c0._8_4_ = fVar165;
    local_7c0._12_4_ = fVar165;
    local_7c0._16_4_ = fVar165;
    local_7c0._20_4_ = fVar165;
    local_7c0._24_4_ = fVar165;
    local_7c0._28_4_ = fVar165;
    auVar82 = vfmadd231ps_fma(auVar222,local_7c0,auVar212._0_32_);
    auVar153._8_4_ = 0x3f800000;
    auVar153._0_8_ = &DAT_3f8000003f800000;
    auVar153._12_4_ = 0x3f800000;
    auVar153._16_4_ = 0x3f800000;
    auVar153._20_4_ = 0x3f800000;
    auVar153._24_4_ = 0x3f800000;
    auVar153._28_4_ = 0x3f800000;
    auVar96 = vsubps_avx(auVar153,ZEXT1632(auVar82));
    auVar67._4_4_ = fStack_25c;
    auVar67._0_4_ = local_260;
    auVar67._8_4_ = fStack_258;
    auVar67._12_4_ = fStack_254;
    auVar67._16_4_ = fStack_250;
    auVar67._20_4_ = fStack_24c;
    auVar67._24_4_ = fStack_248;
    auVar67._28_4_ = fStack_244;
    fVar144 = auVar82._0_4_;
    auVar179._0_4_ = local_260 * fVar144;
    fVar228 = auVar82._4_4_;
    auVar179._4_4_ = fStack_25c * fVar228;
    fVar229 = auVar82._8_4_;
    auVar179._8_4_ = fStack_258 * fVar229;
    fVar231 = auVar82._12_4_;
    auVar179._12_4_ = fStack_254 * fVar231;
    auVar179._16_4_ = fStack_250 * 0.0;
    auVar179._20_4_ = fStack_24c * 0.0;
    auVar179._24_4_ = fStack_248 * 0.0;
    auVar179._28_4_ = 0;
    auVar205._0_4_ = local_280._0_4_ * fVar144;
    auVar205._4_4_ = local_280._4_4_ * fVar228;
    auVar205._8_4_ = local_280._8_4_ * fVar229;
    auVar205._12_4_ = local_280._12_4_ * fVar231;
    auVar205._16_4_ = local_280._16_4_ * 0.0;
    auVar205._20_4_ = local_280._20_4_ * 0.0;
    auVar205._28_36_ = auVar204._28_36_;
    auVar205._24_4_ = local_280._24_4_ * 0.0;
    auVar204._0_4_ = local_2a0._0_4_ * fVar144;
    auVar204._4_4_ = local_2a0._4_4_ * fVar228;
    auVar204._8_4_ = local_2a0._8_4_ * fVar229;
    auVar204._12_4_ = local_2a0._12_4_ * fVar231;
    auVar204._16_4_ = local_2a0._16_4_ * 0.0;
    auVar204._20_4_ = local_2a0._20_4_ * 0.0;
    auVar204._28_36_ = auVar212._28_36_;
    auVar204._24_4_ = local_2a0._24_4_ * 0.0;
    auVar212._0_4_ = local_2c0._0_4_ * fVar144;
    auVar212._4_4_ = local_2c0._4_4_ * fVar228;
    auVar212._8_4_ = local_2c0._8_4_ * fVar229;
    auVar212._12_4_ = local_2c0._12_4_ * fVar231;
    auVar212._16_4_ = local_2c0._16_4_ * 0.0;
    auVar212._20_4_ = local_2c0._20_4_ * 0.0;
    auVar212._28_36_ = auVar219._28_36_;
    auVar212._24_4_ = local_2c0._24_4_ * 0.0;
    auVar68._4_4_ = uStack_1dc;
    auVar68._0_4_ = local_1e0;
    auVar68._8_4_ = uStack_1d8;
    auVar68._12_4_ = uStack_1d4;
    auVar68._16_4_ = uStack_1d0;
    auVar68._20_4_ = uStack_1cc;
    auVar68._24_4_ = uStack_1c8;
    auVar68._28_4_ = uStack_1c4;
    auVar83 = vfmadd231ps_fma(auVar179,auVar96,auVar68);
    auVar84 = vfmadd231ps_fma(auVar205._0_32_,auVar96,local_200);
    auVar85 = vfmadd231ps_fma(auVar204._0_32_,auVar96,local_220);
    auVar80 = vfmadd231ps_fma(auVar212._0_32_,auVar96,local_240);
    auVar66._4_4_ = uStack_2dc;
    auVar66._0_4_ = local_2e0;
    auVar66._8_4_ = uStack_2d8;
    auVar66._12_4_ = uStack_2d4;
    auVar66._16_4_ = uStack_2d0;
    auVar66._20_4_ = uStack_2cc;
    auVar66._24_4_ = uStack_2c8;
    auVar66._28_4_ = uStack_2c4;
    auVar94 = vmulps_avx512vl(auVar66,ZEXT1632(auVar82));
    auVar102 = ZEXT1632(auVar82);
    auVar97 = vmulps_avx512vl(local_300,auVar102);
    auVar98 = vmulps_avx512vl(local_320,auVar102);
    auVar99 = vmulps_avx512vl(local_340,auVar102);
    auVar87 = vfmadd231ps_fma(auVar94,auVar96,auVar67);
    auVar86 = vfmadd231ps_fma(auVar97,auVar96,local_280);
    auVar81 = vfmadd231ps_fma(auVar98,auVar96,local_2a0);
    auVar88 = vfmadd231ps_fma(auVar99,auVar96,local_2c0);
    auVar37._4_4_ = fVar228 * (float)local_360._4_4_;
    auVar37._0_4_ = fVar144 * (float)local_360._0_4_;
    auVar37._8_4_ = fVar229 * fStack_358;
    auVar37._12_4_ = fVar231 * fStack_354;
    auVar37._16_4_ = fStack_350 * 0.0;
    auVar37._20_4_ = fStack_34c * 0.0;
    auVar37._24_4_ = fStack_348 * 0.0;
    auVar37._28_4_ = fStack_244;
    auVar38._4_4_ = fVar228 * (float)local_380._4_4_;
    auVar38._0_4_ = fVar144 * (float)local_380._0_4_;
    auVar38._8_4_ = fVar229 * fStack_378;
    auVar38._12_4_ = fVar231 * fStack_374;
    auVar38._16_4_ = fStack_370 * 0.0;
    auVar38._20_4_ = fStack_36c * 0.0;
    auVar38._24_4_ = fStack_368 * 0.0;
    auVar38._28_4_ = local_280._28_4_;
    auVar39._4_4_ = fVar228 * (float)local_3a0._4_4_;
    auVar39._0_4_ = fVar144 * (float)local_3a0._0_4_;
    auVar39._8_4_ = fVar229 * fStack_398;
    auVar39._12_4_ = fVar231 * fStack_394;
    auVar39._16_4_ = fStack_390 * 0.0;
    auVar39._20_4_ = fStack_38c * 0.0;
    auVar39._24_4_ = fStack_388 * 0.0;
    auVar39._28_4_ = local_2a0._28_4_;
    auVar40._4_4_ = fVar228 * (float)local_3c0._4_4_;
    auVar40._0_4_ = fVar144 * (float)local_3c0._0_4_;
    auVar40._8_4_ = fVar229 * fStack_3b8;
    auVar40._12_4_ = fVar231 * fStack_3b4;
    auVar40._16_4_ = fStack_3b0 * 0.0;
    auVar40._20_4_ = fStack_3ac * 0.0;
    auVar40._24_4_ = fStack_3a8 * 0.0;
    auVar40._28_4_ = local_2c0._28_4_;
    auVar94 = vfmadd231ps_avx512vl(auVar37,auVar96,auVar66);
    auVar97 = vfmadd231ps_avx512vl(auVar38,auVar96,local_300);
    auVar98 = vfmadd231ps_avx512vl(auVar39,auVar96,local_320);
    auVar99 = vfmadd231ps_avx512vl(auVar40,auVar96,local_340);
    auVar95 = vmulps_avx512vl(auVar102,ZEXT1632(auVar87));
    auVar100 = vmulps_avx512vl(auVar102,ZEXT1632(auVar86));
    auVar101 = vmulps_avx512vl(auVar102,ZEXT1632(auVar81));
    auVar102 = vmulps_avx512vl(auVar102,ZEXT1632(auVar88));
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar96,ZEXT1632(auVar83));
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,ZEXT1632(auVar84));
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,ZEXT1632(auVar85));
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar96,ZEXT1632(auVar80));
    auVar180._0_4_ = auVar94._0_4_ * fVar144;
    auVar180._4_4_ = auVar94._4_4_ * fVar228;
    auVar180._8_4_ = auVar94._8_4_ * fVar229;
    auVar180._12_4_ = auVar94._12_4_ * fVar231;
    auVar180._16_4_ = auVar94._16_4_ * 0.0;
    auVar180._20_4_ = auVar94._20_4_ * 0.0;
    auVar180._24_4_ = auVar94._24_4_ * 0.0;
    auVar180._28_4_ = 0;
    auVar41._4_4_ = auVar97._4_4_ * fVar228;
    auVar41._0_4_ = auVar97._0_4_ * fVar144;
    auVar41._8_4_ = auVar97._8_4_ * fVar229;
    auVar41._12_4_ = auVar97._12_4_ * fVar231;
    auVar41._16_4_ = auVar97._16_4_ * 0.0;
    auVar41._20_4_ = auVar97._20_4_ * 0.0;
    auVar41._24_4_ = auVar97._24_4_ * 0.0;
    auVar41._28_4_ = auVar94._28_4_;
    auVar42._4_4_ = auVar98._4_4_ * fVar228;
    auVar42._0_4_ = auVar98._0_4_ * fVar144;
    auVar42._8_4_ = auVar98._8_4_ * fVar229;
    auVar42._12_4_ = auVar98._12_4_ * fVar231;
    auVar42._16_4_ = auVar98._16_4_ * 0.0;
    auVar42._20_4_ = auVar98._20_4_ * 0.0;
    auVar42._24_4_ = auVar98._24_4_ * 0.0;
    auVar42._28_4_ = auVar97._28_4_;
    auVar43._4_4_ = auVar99._4_4_ * fVar228;
    auVar43._0_4_ = auVar99._0_4_ * fVar144;
    auVar43._8_4_ = auVar99._8_4_ * fVar229;
    auVar43._12_4_ = auVar99._12_4_ * fVar231;
    auVar43._16_4_ = auVar99._16_4_ * 0.0;
    auVar43._20_4_ = auVar99._20_4_ * 0.0;
    auVar43._24_4_ = auVar99._24_4_ * 0.0;
    auVar43._28_4_ = auVar98._28_4_;
    auVar83 = vfmadd231ps_fma(auVar180,auVar96,ZEXT1632(auVar87));
    auVar84 = vfmadd231ps_fma(auVar41,auVar96,ZEXT1632(auVar86));
    auVar85 = vfmadd231ps_fma(auVar42,auVar96,ZEXT1632(auVar81));
    auVar80 = vfmadd231ps_fma(auVar43,auVar96,ZEXT1632(auVar88));
    auVar94 = vmulps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar85));
    auVar99 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar231 * auVar83._12_4_,
                                            CONCAT48(fVar229 * auVar83._8_4_,
                                                     CONCAT44(fVar228 * auVar83._4_4_,
                                                              fVar144 * auVar83._0_4_)))),auVar96,
                         auVar95);
    auVar219 = ZEXT3264(auVar99);
    auVar103 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar84._12_4_ * fVar231,
                                             CONCAT48(auVar84._8_4_ * fVar229,
                                                      CONCAT44(auVar84._4_4_ * fVar228,
                                                               auVar84._0_4_ * fVar144)))),auVar96,
                          auVar100);
    auVar93 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar101);
    auVar97 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar80._12_4_ * fVar231,
                                            CONCAT48(auVar80._8_4_ * fVar229,
                                                     CONCAT44(auVar80._4_4_ * fVar228,
                                                              auVar80._0_4_ * fVar144)))),auVar102,
                         auVar96);
    auVar96 = vsubps_avx512vl(ZEXT1632(auVar83),auVar95);
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar84),auVar100);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar85),auVar101);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar80),auVar102);
    auVar240._0_4_ = fVar238 * auVar96._0_4_ * 3.0;
    auVar240._4_4_ = fVar238 * auVar96._4_4_ * 3.0;
    auVar240._8_4_ = fVar238 * auVar96._8_4_ * 3.0;
    auVar240._12_4_ = fVar238 * auVar96._12_4_ * 3.0;
    auVar240._16_4_ = fVar238 * auVar96._16_4_ * 3.0;
    auVar240._20_4_ = fVar238 * auVar96._20_4_ * 3.0;
    auVar240._24_4_ = fVar238 * auVar96._24_4_ * 3.0;
    auVar240._28_4_ = 0;
    auVar242._0_4_ = fVar238 * auVar94._0_4_ * 3.0;
    auVar242._4_4_ = fVar238 * auVar94._4_4_ * 3.0;
    auVar242._8_4_ = fVar238 * auVar94._8_4_ * 3.0;
    auVar242._12_4_ = fVar238 * auVar94._12_4_ * 3.0;
    auVar242._16_4_ = fVar238 * auVar94._16_4_ * 3.0;
    auVar242._20_4_ = fVar238 * auVar94._20_4_ * 3.0;
    auVar242._24_4_ = fVar238 * auVar94._24_4_ * 3.0;
    auVar242._28_4_ = 0;
    auVar243._0_4_ = auVar98._0_4_ * 3.0 * fVar238;
    auVar243._4_4_ = auVar98._4_4_ * 3.0 * fVar238;
    auVar243._8_4_ = auVar98._8_4_ * 3.0 * fVar238;
    auVar243._12_4_ = auVar98._12_4_ * 3.0 * fVar238;
    auVar243._16_4_ = auVar98._16_4_ * 3.0 * fVar238;
    auVar243._20_4_ = auVar98._20_4_ * 3.0 * fVar238;
    auVar243._24_4_ = auVar98._24_4_ * 3.0 * fVar238;
    auVar243._28_4_ = 0;
    fVar144 = auVar95._0_4_ * 3.0 * fVar238;
    fVar228 = auVar95._4_4_ * 3.0 * fVar238;
    auVar44._4_4_ = fVar228;
    auVar44._0_4_ = fVar144;
    fVar229 = auVar95._8_4_ * 3.0 * fVar238;
    auVar44._8_4_ = fVar229;
    fVar231 = auVar95._12_4_ * 3.0 * fVar238;
    auVar44._12_4_ = fVar231;
    fVar233 = auVar95._16_4_ * 3.0 * fVar238;
    auVar44._16_4_ = fVar233;
    fVar206 = auVar95._20_4_ * 3.0 * fVar238;
    auVar44._20_4_ = fVar206;
    fVar234 = auVar95._24_4_ * 3.0 * fVar238;
    auVar44._24_4_ = fVar234;
    auVar44._28_4_ = fVar238;
    auVar82 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar95 = vpermt2ps_avx512vl(auVar99,_DAT_0205fd20,ZEXT1632(auVar82));
    auVar100 = vpermt2ps_avx512vl(auVar103,_DAT_0205fd20,ZEXT1632(auVar82));
    auVar98 = ZEXT1632(auVar82);
    auVar101 = vpermt2ps_avx512vl(auVar93,_DAT_0205fd20,auVar98);
    auVar181._0_4_ = auVar97._0_4_ + fVar144;
    auVar181._4_4_ = auVar97._4_4_ + fVar228;
    auVar181._8_4_ = auVar97._8_4_ + fVar229;
    auVar181._12_4_ = auVar97._12_4_ + fVar231;
    auVar181._16_4_ = auVar97._16_4_ + fVar233;
    auVar181._20_4_ = auVar97._20_4_ + fVar206;
    auVar181._24_4_ = auVar97._24_4_ + fVar234;
    auVar181._28_4_ = auVar97._28_4_ + fVar238;
    auVar96 = vmaxps_avx(auVar97,auVar181);
    auVar94 = vminps_avx(auVar97,auVar181);
    auVar102 = vpermt2ps_avx512vl(auVar97,_DAT_0205fd20,auVar98);
    auVar104 = vpermt2ps_avx512vl(auVar240,_DAT_0205fd20,auVar98);
    auVar105 = vpermt2ps_avx512vl(auVar242,_DAT_0205fd20,auVar98);
    auVar116 = ZEXT1632(auVar82);
    auVar91 = vpermt2ps_avx512vl(auVar243,_DAT_0205fd20,auVar116);
    auVar97 = vpermt2ps_avx512vl(auVar44,_DAT_0205fd20,auVar116);
    auVar92 = vsubps_avx512vl(auVar102,auVar97);
    auVar97 = vsubps_avx(auVar95,auVar99);
    auVar98 = vsubps_avx(auVar100,auVar103);
    auVar106 = vsubps_avx512vl(auVar101,auVar93);
    auVar107 = vmulps_avx512vl(auVar98,auVar243);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar242,auVar106);
    auVar108 = vmulps_avx512vl(auVar106,auVar240);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar243,auVar97);
    auVar109 = vmulps_avx512vl(auVar97,auVar242);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar240,auVar98);
    auVar109 = vmulps_avx512vl(auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar108 = vmulps_avx512vl(auVar106,auVar106);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar98,auVar98);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar97,auVar97);
    auVar109 = vrcp14ps_avx512vl(auVar108);
    auVar110 = vfnmadd213ps_avx512vl(auVar109,auVar108,auVar153);
    auVar109 = vfmadd132ps_avx512vl(auVar110,auVar109,auVar109);
    auVar107 = vmulps_avx512vl(auVar107,auVar109);
    auVar110 = vmulps_avx512vl(auVar98,auVar91);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar105,auVar106);
    auVar111 = vmulps_avx512vl(auVar106,auVar104);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar91,auVar97);
    auVar112 = vmulps_avx512vl(auVar97,auVar105);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar104,auVar98);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vmulps_avx512vl(auVar110,auVar109);
    auVar107 = vmaxps_avx512vl(auVar107,auVar109);
    auVar107 = vsqrtps_avx512vl(auVar107);
    auVar109 = vmaxps_avx512vl(auVar92,auVar102);
    auVar96 = vmaxps_avx512vl(auVar96,auVar109);
    auVar109 = vaddps_avx512vl(auVar107,auVar96);
    auVar96 = vminps_avx512vl(auVar92,auVar102);
    auVar96 = vminps_avx(auVar94,auVar96);
    auVar96 = vsubps_avx512vl(auVar96,auVar107);
    auVar122._8_4_ = 0x3f800002;
    auVar122._0_8_ = 0x3f8000023f800002;
    auVar122._12_4_ = 0x3f800002;
    auVar122._16_4_ = 0x3f800002;
    auVar122._20_4_ = 0x3f800002;
    auVar122._24_4_ = 0x3f800002;
    auVar122._28_4_ = 0x3f800002;
    auVar94 = vmulps_avx512vl(auVar109,auVar122);
    auVar123._8_4_ = 0x3f7ffffc;
    auVar123._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar123._12_4_ = 0x3f7ffffc;
    auVar123._16_4_ = 0x3f7ffffc;
    auVar123._20_4_ = 0x3f7ffffc;
    auVar123._24_4_ = 0x3f7ffffc;
    auVar123._28_4_ = 0x3f7ffffc;
    local_7e0 = vmulps_avx512vl(auVar96,auVar123);
    auVar45._4_4_ = auVar94._4_4_ * auVar94._4_4_;
    auVar45._0_4_ = auVar94._0_4_ * auVar94._0_4_;
    auVar45._8_4_ = auVar94._8_4_ * auVar94._8_4_;
    auVar45._12_4_ = auVar94._12_4_ * auVar94._12_4_;
    auVar45._16_4_ = auVar94._16_4_ * auVar94._16_4_;
    auVar45._20_4_ = auVar94._20_4_ * auVar94._20_4_;
    auVar45._24_4_ = auVar94._24_4_ * auVar94._24_4_;
    auVar45._28_4_ = local_7e0._28_4_;
    auVar96 = vrsqrt14ps_avx512vl(auVar108);
    auVar23._8_4_ = 0xbf000000;
    auVar23._0_8_ = 0xbf000000bf000000;
    auVar23._12_4_ = 0xbf000000;
    auVar23._16_4_ = 0xbf000000;
    auVar23._20_4_ = 0xbf000000;
    auVar23._24_4_ = 0xbf000000;
    auVar23._28_4_ = 0xbf000000;
    auVar94 = vmulps_avx512vl(auVar108,auVar23);
    auVar46._4_4_ = auVar96._4_4_ * auVar94._4_4_;
    auVar46._0_4_ = auVar96._0_4_ * auVar94._0_4_;
    auVar46._8_4_ = auVar96._8_4_ * auVar94._8_4_;
    auVar46._12_4_ = auVar96._12_4_ * auVar94._12_4_;
    auVar46._16_4_ = auVar96._16_4_ * auVar94._16_4_;
    auVar46._20_4_ = auVar96._20_4_ * auVar94._20_4_;
    auVar46._24_4_ = auVar96._24_4_ * auVar94._24_4_;
    auVar46._28_4_ = auVar94._28_4_;
    auVar94 = vmulps_avx512vl(auVar96,auVar96);
    auVar94 = vmulps_avx512vl(auVar94,auVar46);
    auVar24._8_4_ = 0x3fc00000;
    auVar24._0_8_ = 0x3fc000003fc00000;
    auVar24._12_4_ = 0x3fc00000;
    auVar24._16_4_ = 0x3fc00000;
    auVar24._20_4_ = 0x3fc00000;
    auVar24._24_4_ = 0x3fc00000;
    auVar24._28_4_ = 0x3fc00000;
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar24);
    auVar47._4_4_ = auVar94._4_4_ * auVar97._4_4_;
    auVar47._0_4_ = auVar94._0_4_ * auVar97._0_4_;
    auVar47._8_4_ = auVar94._8_4_ * auVar97._8_4_;
    auVar47._12_4_ = auVar94._12_4_ * auVar97._12_4_;
    auVar47._16_4_ = auVar94._16_4_ * auVar97._16_4_;
    auVar47._20_4_ = auVar94._20_4_ * auVar97._20_4_;
    auVar47._24_4_ = auVar94._24_4_ * auVar97._24_4_;
    auVar47._28_4_ = auVar96._28_4_;
    auVar96 = vmulps_avx512vl(auVar98,auVar94);
    auVar102 = vmulps_avx512vl(auVar106,auVar94);
    auVar92 = vsubps_avx512vl(auVar116,auVar99);
    auVar107 = vsubps_avx512vl(auVar116,auVar103);
    auVar108 = vsubps_avx512vl(auVar116,auVar93);
    auVar109 = vmulps_avx512vl(auVar244._0_32_,auVar108);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar246._0_32_,auVar107);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar245._0_32_,auVar92);
    auVar110 = vmulps_avx512vl(auVar108,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar107,auVar107);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar92,auVar92);
    auVar111 = vmulps_avx512vl(auVar244._0_32_,auVar102);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar96,auVar246._0_32_);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar47,auVar245._0_32_);
    auVar102 = vmulps_avx512vl(auVar108,auVar102);
    auVar96 = vfmadd231ps_avx512vl(auVar102,auVar107,auVar96);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar47);
    local_640 = vmulps_avx512vl(auVar111,auVar111);
    auVar102 = vsubps_avx512vl(local_3e0,local_640);
    auVar112 = vmulps_avx512vl(auVar111,auVar96);
    auVar109 = vsubps_avx512vl(auVar109,auVar112);
    auVar109 = vaddps_avx512vl(auVar109,auVar109);
    auVar112 = vmulps_avx512vl(auVar96,auVar96);
    auVar110 = vsubps_avx512vl(auVar110,auVar112);
    auVar112 = vsubps_avx512vl(auVar110,auVar45);
    auVar113 = vmulps_avx512vl(auVar109,auVar109);
    auVar25._8_4_ = 0x40800000;
    auVar25._0_8_ = 0x4080000040800000;
    auVar25._12_4_ = 0x40800000;
    auVar25._16_4_ = 0x40800000;
    auVar25._20_4_ = 0x40800000;
    auVar25._24_4_ = 0x40800000;
    auVar25._28_4_ = 0x40800000;
    auVar114 = vmulps_avx512vl(auVar102,auVar25);
    auVar115 = vmulps_avx512vl(auVar114,auVar112);
    auVar115 = vsubps_avx512vl(auVar113,auVar115);
    auVar82 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
    uVar79 = vcmpps_avx512vl(auVar115,auVar116,5);
    bVar69 = (byte)uVar79;
    if (bVar69 == 0) {
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar115 = vsqrtps_avx512vl(auVar115);
      auVar116 = vaddps_avx512vl(auVar102,auVar102);
      auVar117 = vrcp14ps_avx512vl(auVar116);
      auVar116 = vfnmadd213ps_avx512vl(auVar116,auVar117,auVar153);
      auVar116 = vfmadd132ps_avx512vl(auVar116,auVar117,auVar117);
      auVar26._8_4_ = 0x80000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar26._12_4_ = 0x80000000;
      auVar26._16_4_ = 0x80000000;
      auVar26._20_4_ = 0x80000000;
      auVar26._24_4_ = 0x80000000;
      auVar26._28_4_ = 0x80000000;
      auVar117 = vxorps_avx512vl(auVar109,auVar26);
      auVar117 = vsubps_avx512vl(auVar117,auVar115);
      auVar117 = vmulps_avx512vl(auVar117,auVar116);
      auVar115 = vsubps_avx512vl(auVar115,auVar109);
      auVar115 = vmulps_avx512vl(auVar115,auVar116);
      auVar116 = vfmadd213ps_avx512vl(auVar111,auVar117,auVar96);
      local_4e0 = vmulps_avx512vl(auVar94,auVar116);
      auVar116 = vfmadd213ps_avx512vl(auVar111,auVar115,auVar96);
      local_500 = vmulps_avx512vl(auVar94,auVar116);
      auVar154._8_4_ = 0x7f800000;
      auVar154._0_8_ = 0x7f8000007f800000;
      auVar154._12_4_ = 0x7f800000;
      auVar154._16_4_ = 0x7f800000;
      auVar154._20_4_ = 0x7f800000;
      auVar154._24_4_ = 0x7f800000;
      auVar154._28_4_ = 0x7f800000;
      auVar116 = vblendmps_avx512vl(auVar154,auVar117);
      auVar118._0_4_ =
           (uint)(bVar69 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar69 & 1) * local_500._0_4_;
      bVar5 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar5 * auVar116._4_4_ | (uint)!bVar5 * local_500._4_4_;
      bVar5 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar5 * auVar116._8_4_ | (uint)!bVar5 * local_500._8_4_;
      bVar5 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar5 * auVar116._12_4_ | (uint)!bVar5 * local_500._12_4_;
      bVar5 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar5 * auVar116._16_4_ | (uint)!bVar5 * local_500._16_4_;
      bVar5 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar5 * auVar116._20_4_ | (uint)!bVar5 * local_500._20_4_;
      bVar5 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar5 * auVar116._24_4_ | (uint)!bVar5 * local_500._24_4_;
      bVar5 = SUB81(uVar79 >> 7,0);
      auVar118._28_4_ = (uint)bVar5 * auVar116._28_4_ | (uint)!bVar5 * local_500._28_4_;
      auVar155._8_4_ = 0xff800000;
      auVar155._0_8_ = 0xff800000ff800000;
      auVar155._12_4_ = 0xff800000;
      auVar155._16_4_ = 0xff800000;
      auVar155._20_4_ = 0xff800000;
      auVar155._24_4_ = 0xff800000;
      auVar155._28_4_ = 0xff800000;
      auVar116 = vblendmps_avx512vl(auVar155,auVar115);
      auVar119._0_4_ =
           (uint)(bVar69 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar115._0_4_;
      bVar5 = (bool)((byte)(uVar79 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar5 * auVar116._4_4_ | (uint)!bVar5 * auVar115._4_4_;
      bVar5 = (bool)((byte)(uVar79 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar5 * auVar116._8_4_ | (uint)!bVar5 * auVar115._8_4_;
      bVar5 = (bool)((byte)(uVar79 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar5 * auVar116._12_4_ | (uint)!bVar5 * auVar115._12_4_;
      bVar5 = (bool)((byte)(uVar79 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar5 * auVar116._16_4_ | (uint)!bVar5 * auVar115._16_4_;
      bVar5 = (bool)((byte)(uVar79 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar5 * auVar116._20_4_ | (uint)!bVar5 * auVar115._20_4_;
      bVar5 = (bool)((byte)(uVar79 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar5 * auVar116._24_4_ | (uint)!bVar5 * auVar115._24_4_;
      bVar5 = SUB81(uVar79 >> 7,0);
      auVar119._28_4_ = (uint)bVar5 * auVar116._28_4_ | (uint)!bVar5 * auVar115._28_4_;
      auVar156._8_4_ = 0x7fffffff;
      auVar156._0_8_ = 0x7fffffff7fffffff;
      auVar156._12_4_ = 0x7fffffff;
      auVar156._16_4_ = 0x7fffffff;
      auVar156._20_4_ = 0x7fffffff;
      auVar156._24_4_ = 0x7fffffff;
      auVar156._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_640,auVar156);
      auVar115 = vmaxps_avx512vl(local_4a0,local_640);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      auVar116 = vmulps_avx512vl(auVar115,auVar27);
      auVar115 = vandps_avx(auVar102,auVar156);
      uVar75 = vcmpps_avx512vl(auVar115,auVar116,1);
      uVar79 = uVar79 & uVar75;
      bVar74 = (byte)uVar79;
      if (bVar74 != 0) {
        uVar75 = vcmpps_avx512vl(auVar112,ZEXT1632(auVar82),2);
        auVar187._8_4_ = 0xff800000;
        auVar187._0_8_ = 0xff800000ff800000;
        auVar187._12_4_ = 0xff800000;
        auVar187._16_4_ = 0xff800000;
        auVar187._20_4_ = 0xff800000;
        auVar187._24_4_ = 0xff800000;
        auVar187._28_4_ = 0xff800000;
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar116 = vblendmps_avx512vl(auVar112,auVar187);
        bVar71 = (byte)uVar75;
        uVar73 = (uint)(bVar71 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar115._0_4_;
        bVar5 = (bool)((byte)(uVar75 >> 1) & 1);
        uVar137 = (uint)bVar5 * auVar116._4_4_ | (uint)!bVar5 * auVar115._4_4_;
        bVar5 = (bool)((byte)(uVar75 >> 2) & 1);
        uVar138 = (uint)bVar5 * auVar116._8_4_ | (uint)!bVar5 * auVar115._8_4_;
        bVar5 = (bool)((byte)(uVar75 >> 3) & 1);
        uVar139 = (uint)bVar5 * auVar116._12_4_ | (uint)!bVar5 * auVar115._12_4_;
        bVar5 = (bool)((byte)(uVar75 >> 4) & 1);
        uVar140 = (uint)bVar5 * auVar116._16_4_ | (uint)!bVar5 * auVar115._16_4_;
        bVar5 = (bool)((byte)(uVar75 >> 5) & 1);
        uVar141 = (uint)bVar5 * auVar116._20_4_ | (uint)!bVar5 * auVar115._20_4_;
        bVar5 = (bool)((byte)(uVar75 >> 6) & 1);
        uVar142 = (uint)bVar5 * auVar116._24_4_ | (uint)!bVar5 * auVar115._24_4_;
        bVar5 = SUB81(uVar75 >> 7,0);
        uVar143 = (uint)bVar5 * auVar116._28_4_ | (uint)!bVar5 * auVar115._28_4_;
        auVar118._0_4_ = (bVar74 & 1) * uVar73 | !(bool)(bVar74 & 1) * auVar118._0_4_;
        bVar5 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar118._4_4_ = bVar5 * uVar137 | !bVar5 * auVar118._4_4_;
        bVar5 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar118._8_4_ = bVar5 * uVar138 | !bVar5 * auVar118._8_4_;
        bVar5 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar118._12_4_ = bVar5 * uVar139 | !bVar5 * auVar118._12_4_;
        bVar5 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar118._16_4_ = bVar5 * uVar140 | !bVar5 * auVar118._16_4_;
        bVar5 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar118._20_4_ = bVar5 * uVar141 | !bVar5 * auVar118._20_4_;
        bVar5 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar118._24_4_ = bVar5 * uVar142 | !bVar5 * auVar118._24_4_;
        bVar5 = SUB81(uVar79 >> 7,0);
        auVar118._28_4_ = bVar5 * uVar143 | !bVar5 * auVar118._28_4_;
        auVar112 = vblendmps_avx512vl(auVar187,auVar112);
        bVar5 = (bool)((byte)(uVar75 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar75 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar75 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar75 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar75 >> 6) & 1);
        bVar11 = SUB81(uVar75 >> 7,0);
        auVar119._0_4_ =
             (uint)(bVar74 & 1) *
             ((uint)(bVar71 & 1) * auVar112._0_4_ | !(bool)(bVar71 & 1) * uVar73) |
             !(bool)(bVar74 & 1) * auVar119._0_4_;
        bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
        auVar119._4_4_ =
             (uint)bVar78 * ((uint)bVar5 * auVar112._4_4_ | !bVar5 * uVar137) |
             !bVar78 * auVar119._4_4_;
        bVar5 = (bool)((byte)(uVar79 >> 2) & 1);
        auVar119._8_4_ =
             (uint)bVar5 * ((uint)bVar6 * auVar112._8_4_ | !bVar6 * uVar138) |
             !bVar5 * auVar119._8_4_;
        bVar5 = (bool)((byte)(uVar79 >> 3) & 1);
        auVar119._12_4_ =
             (uint)bVar5 * ((uint)bVar7 * auVar112._12_4_ | !bVar7 * uVar139) |
             !bVar5 * auVar119._12_4_;
        bVar5 = (bool)((byte)(uVar79 >> 4) & 1);
        auVar119._16_4_ =
             (uint)bVar5 * ((uint)bVar8 * auVar112._16_4_ | !bVar8 * uVar140) |
             !bVar5 * auVar119._16_4_;
        bVar5 = (bool)((byte)(uVar79 >> 5) & 1);
        auVar119._20_4_ =
             (uint)bVar5 * ((uint)bVar9 * auVar112._20_4_ | !bVar9 * uVar141) |
             !bVar5 * auVar119._20_4_;
        bVar5 = (bool)((byte)(uVar79 >> 6) & 1);
        auVar119._24_4_ =
             (uint)bVar5 * ((uint)bVar10 * auVar112._24_4_ | !bVar10 * uVar142) |
             !bVar5 * auVar119._24_4_;
        bVar5 = SUB81(uVar79 >> 7,0);
        auVar119._28_4_ =
             (uint)bVar5 * ((uint)bVar11 * auVar112._28_4_ | !bVar11 * uVar143) |
             !bVar5 * auVar119._28_4_;
        bVar69 = (~bVar74 | bVar71) & bVar69;
      }
      auVar153._8_4_ = 0x3f800000;
      auVar153._0_8_ = &DAT_3f8000003f800000;
      auVar153._12_4_ = 0x3f800000;
      auVar153._16_4_ = 0x3f800000;
      auVar153._20_4_ = 0x3f800000;
      auVar153._24_4_ = 0x3f800000;
      auVar153._28_4_ = 0x3f800000;
    }
    in_ZMM31 = ZEXT3264(auVar119);
    if ((bVar69 & 0x7f) == 0) {
      auVar212 = ZEXT3264(_DAT_02020f20);
      auVar245 = ZEXT3264(local_880);
      auVar246 = ZEXT3264(local_8a0);
      auVar244 = ZEXT3264(local_800);
    }
    else {
      fVar144 = *(float *)(ray + k * 4 + 0x80) - (float)local_760._0_4_;
      auVar157._4_4_ = fVar144;
      auVar157._0_4_ = fVar144;
      auVar157._8_4_ = fVar144;
      auVar157._12_4_ = fVar144;
      auVar157._16_4_ = fVar144;
      auVar157._20_4_ = fVar144;
      auVar157._24_4_ = fVar144;
      auVar157._28_4_ = fVar144;
      auVar112 = vminps_avx512vl(auVar157,auVar119);
      auVar65._4_4_ = fStack_3fc;
      auVar65._0_4_ = local_400;
      auVar65._8_4_ = fStack_3f8;
      auVar65._12_4_ = fStack_3f4;
      auVar65._16_4_ = fStack_3f0;
      auVar65._20_4_ = fStack_3ec;
      auVar65._24_4_ = fStack_3e8;
      auVar65._28_4_ = fStack_3e4;
      auVar115 = vmaxps_avx512vl(auVar65,auVar118);
      auVar108 = vmulps_avx512vl(auVar108,auVar243);
      auVar107 = vfmadd213ps_avx512vl(auVar107,auVar242,auVar108);
      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar240,auVar107);
      auVar244 = ZEXT3264(local_800);
      auVar107 = vmulps_avx512vl(local_800,auVar243);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_8a0,auVar242);
      in_ZMM31 = ZEXT3264(local_880);
      auVar107 = vfmadd231ps_avx512vl(auVar107,local_880,auVar240);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar107,auVar108);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar13 = vcmpps_avx512vl(auVar108,auVar116,1);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar92 = vxorps_avx512vl(auVar92,auVar117);
      auVar120 = vrcp14ps_avx512vl(auVar107);
      auVar121 = vxorps_avx512vl(auVar107,auVar117);
      auVar122 = vfnmadd213ps_avx512vl(auVar120,auVar107,auVar153);
      auVar122 = vfmadd132ps_avx512vl(auVar122,auVar120,auVar120);
      auVar122 = vmulps_avx512vl(auVar122,auVar92);
      uVar14 = vcmpps_avx512vl(auVar107,auVar121,1);
      bVar74 = (byte)uVar13 | (byte)uVar14;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar92 = vblendmps_avx512vl(auVar122,auVar123);
      auVar124._0_4_ =
           (uint)(bVar74 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar120._0_4_;
      bVar5 = (bool)(bVar74 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar5 * auVar92._4_4_ | (uint)!bVar5 * auVar120._4_4_;
      bVar5 = (bool)(bVar74 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar5 * auVar92._8_4_ | (uint)!bVar5 * auVar120._8_4_;
      bVar5 = (bool)(bVar74 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar5 * auVar92._12_4_ | (uint)!bVar5 * auVar120._12_4_;
      bVar5 = (bool)(bVar74 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar5 * auVar92._16_4_ | (uint)!bVar5 * auVar120._16_4_;
      bVar5 = (bool)(bVar74 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar5 * auVar92._20_4_ | (uint)!bVar5 * auVar120._20_4_;
      bVar5 = (bool)(bVar74 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar5 * auVar92._24_4_ | (uint)!bVar5 * auVar120._24_4_;
      auVar124._28_4_ =
           (uint)(bVar74 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar120._28_4_;
      auVar92 = vmaxps_avx(auVar115,auVar124);
      uVar14 = vcmpps_avx512vl(auVar107,auVar121,6);
      bVar74 = (byte)uVar13 | (byte)uVar14;
      auVar125._0_4_ = (uint)(bVar74 & 1) * 0x7f800000 | (uint)!(bool)(bVar74 & 1) * auVar122._0_4_;
      bVar5 = (bool)(bVar74 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar122._4_4_;
      bVar5 = (bool)(bVar74 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar122._8_4_;
      bVar5 = (bool)(bVar74 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar122._12_4_;
      bVar5 = (bool)(bVar74 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar122._16_4_;
      bVar5 = (bool)(bVar74 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar122._20_4_;
      bVar5 = (bool)(bVar74 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar122._24_4_;
      auVar125._28_4_ =
           (uint)(bVar74 >> 7) * 0x7f800000 | (uint)!(bool)(bVar74 >> 7) * auVar122._28_4_;
      auVar107 = vminps_avx(auVar112,auVar125);
      auVar82 = vxorps_avx512vl(auVar121._0_16_,auVar121._0_16_);
      auVar95 = vsubps_avx512vl(ZEXT1632(auVar82),auVar95);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar82),auVar100);
      auVar112 = ZEXT1632(auVar82);
      auVar101 = vsubps_avx512vl(auVar112,auVar101);
      auVar48._4_4_ = auVar101._4_4_ * auVar91._4_4_;
      auVar48._0_4_ = auVar101._0_4_ * auVar91._0_4_;
      auVar48._8_4_ = auVar101._8_4_ * auVar91._8_4_;
      auVar48._12_4_ = auVar101._12_4_ * auVar91._12_4_;
      auVar48._16_4_ = auVar101._16_4_ * auVar91._16_4_;
      auVar48._20_4_ = auVar101._20_4_ * auVar91._20_4_;
      auVar48._24_4_ = auVar101._24_4_ * auVar91._24_4_;
      auVar48._28_4_ = auVar101._28_4_;
      auVar100 = vfnmsub231ps_avx512vl(auVar48,auVar105,auVar100);
      auVar95 = vfnmadd231ps_avx512vl(auVar100,auVar104,auVar95);
      auVar100 = vmulps_avx512vl(local_800,auVar91);
      auVar100 = vfnmsub231ps_avx512vl(auVar100,local_8a0,auVar105);
      auVar100 = vfnmadd231ps_avx512vl(auVar100,local_880,auVar104);
      vandps_avx512vl(auVar100,auVar108);
      uVar13 = vcmpps_avx512vl(auVar100,auVar116,1);
      auVar95 = vxorps_avx512vl(auVar95,auVar117);
      auVar101 = vrcp14ps_avx512vl(auVar100);
      auVar104 = vxorps_avx512vl(auVar100,auVar117);
      auVar91 = vfnmadd213ps_avx512vl(auVar101,auVar100,auVar153);
      auVar82 = vfmadd132ps_fma(auVar91,auVar101,auVar101);
      fVar144 = auVar82._0_4_ * auVar95._0_4_;
      fVar228 = auVar82._4_4_ * auVar95._4_4_;
      auVar49._4_4_ = fVar228;
      auVar49._0_4_ = fVar144;
      fVar229 = auVar82._8_4_ * auVar95._8_4_;
      auVar49._8_4_ = fVar229;
      fVar231 = auVar82._12_4_ * auVar95._12_4_;
      auVar49._12_4_ = fVar231;
      fVar238 = auVar95._16_4_ * 0.0;
      auVar49._16_4_ = fVar238;
      fVar233 = auVar95._20_4_ * 0.0;
      auVar49._20_4_ = fVar233;
      fVar206 = auVar95._24_4_ * 0.0;
      auVar49._24_4_ = fVar206;
      auVar49._28_4_ = auVar95._28_4_;
      uVar14 = vcmpps_avx512vl(auVar100,auVar104,1);
      bVar74 = (byte)uVar13 | (byte)uVar14;
      auVar91 = vblendmps_avx512vl(auVar49,auVar123);
      auVar126._0_4_ =
           (uint)(bVar74 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar101._0_4_;
      bVar5 = (bool)(bVar74 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar5 * auVar91._4_4_ | (uint)!bVar5 * auVar101._4_4_;
      bVar5 = (bool)(bVar74 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar5 * auVar91._8_4_ | (uint)!bVar5 * auVar101._8_4_;
      bVar5 = (bool)(bVar74 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar5 * auVar91._12_4_ | (uint)!bVar5 * auVar101._12_4_;
      bVar5 = (bool)(bVar74 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar5 * auVar91._16_4_ | (uint)!bVar5 * auVar101._16_4_;
      bVar5 = (bool)(bVar74 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar5 * auVar91._20_4_ | (uint)!bVar5 * auVar101._20_4_;
      bVar5 = (bool)(bVar74 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar5 * auVar91._24_4_ | (uint)!bVar5 * auVar101._24_4_;
      auVar126._28_4_ =
           (uint)(bVar74 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar101._28_4_;
      _local_680 = vmaxps_avx(auVar92,auVar126);
      uVar14 = vcmpps_avx512vl(auVar100,auVar104,6);
      bVar74 = (byte)uVar13 | (byte)uVar14;
      auVar127._0_4_ = (uint)(bVar74 & 1) * 0x7f800000 | (uint)!(bool)(bVar74 & 1) * (int)fVar144;
      bVar5 = (bool)(bVar74 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar228;
      bVar5 = (bool)(bVar74 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar229;
      bVar5 = (bool)(bVar74 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar231;
      bVar5 = (bool)(bVar74 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar238;
      bVar5 = (bool)(bVar74 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar233;
      bVar5 = (bool)(bVar74 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar206;
      auVar127._28_4_ =
           (uint)(bVar74 >> 7) * 0x7f800000 | (uint)!(bool)(bVar74 >> 7) * auVar95._28_4_;
      local_460 = vminps_avx(auVar107,auVar127);
      uVar13 = vcmpps_avx512vl(_local_680,local_460,2);
      bVar69 = bVar69 & 0x7f & (byte)uVar13;
      if (bVar69 == 0) {
        auVar212 = ZEXT3264(_DAT_02020f20);
        auVar245 = ZEXT3264(local_880);
        auVar246 = ZEXT3264(local_8a0);
      }
      else {
        auVar101 = vmaxps_avx512vl(auVar112,local_7e0);
        auVar95 = vminps_avx512vl(local_4e0,auVar153);
        auVar55 = ZEXT412(0);
        auVar100 = ZEXT1232(auVar55) << 0x20;
        auVar95 = vmaxps_avx(auVar95,ZEXT1232(auVar55) << 0x20);
        auVar104 = vminps_avx512vl(local_500,auVar153);
        auVar50._4_4_ = (auVar95._4_4_ + 1.0) * 0.125;
        auVar50._0_4_ = (auVar95._0_4_ + 0.0) * 0.125;
        auVar50._8_4_ = (auVar95._8_4_ + 2.0) * 0.125;
        auVar50._12_4_ = (auVar95._12_4_ + 3.0) * 0.125;
        auVar50._16_4_ = (auVar95._16_4_ + 4.0) * 0.125;
        auVar50._20_4_ = (auVar95._20_4_ + 5.0) * 0.125;
        auVar50._24_4_ = (auVar95._24_4_ + 6.0) * 0.125;
        auVar50._28_4_ = auVar95._28_4_ + 7.0;
        auVar82 = vfmadd213ps_fma(auVar50,local_7c0,auVar222);
        local_4e0 = ZEXT1632(auVar82);
        auVar95 = vmaxps_avx(auVar104,ZEXT1232(auVar55) << 0x20);
        auVar51._4_4_ = (auVar95._4_4_ + 1.0) * 0.125;
        auVar51._0_4_ = (auVar95._0_4_ + 0.0) * 0.125;
        auVar51._8_4_ = (auVar95._8_4_ + 2.0) * 0.125;
        auVar51._12_4_ = (auVar95._12_4_ + 3.0) * 0.125;
        auVar51._16_4_ = (auVar95._16_4_ + 4.0) * 0.125;
        auVar51._20_4_ = (auVar95._20_4_ + 5.0) * 0.125;
        auVar51._24_4_ = (auVar95._24_4_ + 6.0) * 0.125;
        auVar51._28_4_ = auVar95._28_4_ + 7.0;
        auVar82 = vfmadd213ps_fma(auVar51,local_7c0,auVar222);
        local_500 = ZEXT1632(auVar82);
        auVar158._0_4_ = auVar101._0_4_ * auVar101._0_4_;
        auVar158._4_4_ = auVar101._4_4_ * auVar101._4_4_;
        auVar158._8_4_ = auVar101._8_4_ * auVar101._8_4_;
        auVar158._12_4_ = auVar101._12_4_ * auVar101._12_4_;
        auVar158._16_4_ = auVar101._16_4_ * auVar101._16_4_;
        auVar158._20_4_ = auVar101._20_4_ * auVar101._20_4_;
        auVar158._24_4_ = auVar101._24_4_ * auVar101._24_4_;
        auVar158._28_4_ = 0;
        auVar95 = vsubps_avx(auVar110,auVar158);
        auVar101 = vmulps_avx512vl(auVar114,auVar95);
        auVar101 = vsubps_avx512vl(auVar113,auVar101);
        uVar13 = vcmpps_avx512vl(auVar101,ZEXT1232(auVar55) << 0x20,5);
        bVar74 = (byte)uVar13;
        if (bVar74 == 0) {
          auVar96 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar104 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar105 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar128._8_4_ = 0x7f800000;
          auVar128._0_8_ = 0x7f8000007f800000;
          auVar128._12_4_ = 0x7f800000;
          auVar128._16_4_ = 0x7f800000;
          auVar128._20_4_ = 0x7f800000;
          auVar128._24_4_ = 0x7f800000;
          auVar128._28_4_ = 0x7f800000;
          auVar129._8_4_ = 0xff800000;
          auVar129._0_8_ = 0xff800000ff800000;
          auVar129._12_4_ = 0xff800000;
          auVar129._16_4_ = 0xff800000;
          auVar129._20_4_ = 0xff800000;
          auVar129._24_4_ = 0xff800000;
          auVar129._28_4_ = 0xff800000;
        }
        else {
          auVar83 = vxorps_avx512vl(auVar105._0_16_,auVar105._0_16_);
          uVar79 = vcmpps_avx512vl(auVar101,auVar112,5);
          auVar100 = vsqrtps_avx(auVar101);
          auVar182._0_4_ = auVar102._0_4_ + auVar102._0_4_;
          auVar182._4_4_ = auVar102._4_4_ + auVar102._4_4_;
          auVar182._8_4_ = auVar102._8_4_ + auVar102._8_4_;
          auVar182._12_4_ = auVar102._12_4_ + auVar102._12_4_;
          auVar182._16_4_ = auVar102._16_4_ + auVar102._16_4_;
          auVar182._20_4_ = auVar102._20_4_ + auVar102._20_4_;
          auVar182._24_4_ = auVar102._24_4_ + auVar102._24_4_;
          auVar182._28_4_ = auVar102._28_4_ + auVar102._28_4_;
          auVar101 = vrcp14ps_avx512vl(auVar182);
          auVar104 = vfnmadd213ps_avx512vl(auVar182,auVar101,auVar153);
          auVar82 = vfmadd132ps_fma(auVar104,auVar101,auVar101);
          auVar28._8_4_ = 0x80000000;
          auVar28._0_8_ = 0x8000000080000000;
          auVar28._12_4_ = 0x80000000;
          auVar28._16_4_ = 0x80000000;
          auVar28._20_4_ = 0x80000000;
          auVar28._24_4_ = 0x80000000;
          auVar28._28_4_ = 0x80000000;
          auVar101 = vxorps_avx512vl(auVar109,auVar28);
          auVar101 = vsubps_avx(auVar101,auVar100);
          auVar52._4_4_ = auVar101._4_4_ * auVar82._4_4_;
          auVar52._0_4_ = auVar101._0_4_ * auVar82._0_4_;
          auVar52._8_4_ = auVar101._8_4_ * auVar82._8_4_;
          auVar52._12_4_ = auVar101._12_4_ * auVar82._12_4_;
          auVar52._16_4_ = auVar101._16_4_ * 0.0;
          auVar52._20_4_ = auVar101._20_4_ * 0.0;
          auVar52._24_4_ = auVar101._24_4_ * 0.0;
          auVar52._28_4_ = 0x3e000000;
          auVar100 = vsubps_avx512vl(auVar100,auVar109);
          auVar53._4_4_ = auVar100._4_4_ * auVar82._4_4_;
          auVar53._0_4_ = auVar100._0_4_ * auVar82._0_4_;
          auVar53._8_4_ = auVar100._8_4_ * auVar82._8_4_;
          auVar53._12_4_ = auVar100._12_4_ * auVar82._12_4_;
          auVar53._16_4_ = auVar100._16_4_ * 0.0;
          auVar53._20_4_ = auVar100._20_4_ * 0.0;
          auVar53._24_4_ = auVar100._24_4_ * 0.0;
          auVar53._28_4_ = fVar165;
          auVar100 = vfmadd213ps_avx512vl(auVar111,auVar52,auVar96);
          auVar54._4_4_ = auVar94._4_4_ * auVar100._4_4_;
          auVar54._0_4_ = auVar94._0_4_ * auVar100._0_4_;
          auVar54._8_4_ = auVar94._8_4_ * auVar100._8_4_;
          auVar54._12_4_ = auVar94._12_4_ * auVar100._12_4_;
          auVar54._16_4_ = auVar94._16_4_ * auVar100._16_4_;
          auVar54._20_4_ = auVar94._20_4_ * auVar100._20_4_;
          auVar54._24_4_ = auVar94._24_4_ * auVar100._24_4_;
          auVar54._28_4_ = auVar101._28_4_;
          auVar100 = vmulps_avx512vl(local_880,auVar52);
          auVar101 = vmulps_avx512vl(local_8a0,auVar52);
          auVar91 = vmulps_avx512vl(local_800,auVar52);
          auVar104 = vfmadd213ps_avx512vl(auVar97,auVar54,auVar99);
          auVar104 = vsubps_avx512vl(auVar100,auVar104);
          auVar100 = vfmadd213ps_avx512vl(auVar98,auVar54,auVar103);
          auVar105 = vsubps_avx512vl(auVar101,auVar100);
          auVar82 = vfmadd213ps_fma(auVar54,auVar106,auVar93);
          auVar101 = vsubps_avx(auVar91,ZEXT1632(auVar82));
          auVar96 = vfmadd213ps_avx512vl(auVar111,auVar53,auVar96);
          auVar94 = vmulps_avx512vl(auVar94,auVar96);
          auVar96 = vmulps_avx512vl(local_880,auVar53);
          auVar91 = vmulps_avx512vl(local_8a0,auVar53);
          auVar92 = vmulps_avx512vl(local_800,auVar53);
          auVar82 = vfmadd213ps_fma(auVar97,auVar94,auVar99);
          auVar100 = vsubps_avx(auVar96,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar98,auVar94,auVar103);
          auVar96 = vsubps_avx512vl(auVar91,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar106,auVar94,auVar93);
          auVar94 = vsubps_avx512vl(auVar92,ZEXT1632(auVar82));
          auVar200._8_4_ = 0x7f800000;
          auVar200._0_8_ = 0x7f8000007f800000;
          auVar200._12_4_ = 0x7f800000;
          auVar200._16_4_ = 0x7f800000;
          auVar200._20_4_ = 0x7f800000;
          auVar200._24_4_ = 0x7f800000;
          auVar200._28_4_ = 0x7f800000;
          auVar97 = vblendmps_avx512vl(auVar200,auVar52);
          bVar5 = (bool)((byte)uVar79 & 1);
          auVar128._0_4_ = (uint)bVar5 * auVar97._0_4_ | (uint)!bVar5 * auVar99._0_4_;
          bVar5 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar5 * auVar97._4_4_ | (uint)!bVar5 * auVar99._4_4_;
          bVar5 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar5 * auVar97._8_4_ | (uint)!bVar5 * auVar99._8_4_;
          bVar5 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar5 * auVar97._12_4_ | (uint)!bVar5 * auVar99._12_4_;
          bVar5 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar128._16_4_ = (uint)bVar5 * auVar97._16_4_ | (uint)!bVar5 * auVar99._16_4_;
          bVar5 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar128._20_4_ = (uint)bVar5 * auVar97._20_4_ | (uint)!bVar5 * auVar99._20_4_;
          bVar5 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar128._24_4_ = (uint)bVar5 * auVar97._24_4_ | (uint)!bVar5 * auVar99._24_4_;
          bVar5 = SUB81(uVar79 >> 7,0);
          auVar128._28_4_ = (uint)bVar5 * auVar97._28_4_ | (uint)!bVar5 * auVar99._28_4_;
          auVar201._8_4_ = 0xff800000;
          auVar201._0_8_ = 0xff800000ff800000;
          auVar201._12_4_ = 0xff800000;
          auVar201._16_4_ = 0xff800000;
          auVar201._20_4_ = 0xff800000;
          auVar201._24_4_ = 0xff800000;
          auVar201._28_4_ = 0xff800000;
          auVar97 = vblendmps_avx512vl(auVar201,auVar53);
          bVar5 = (bool)((byte)uVar79 & 1);
          auVar129._0_4_ = (uint)bVar5 * auVar97._0_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar79 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar5 * auVar97._4_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar79 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar5 * auVar97._8_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar79 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar5 * auVar97._12_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar79 >> 4) & 1);
          auVar129._16_4_ = (uint)bVar5 * auVar97._16_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar79 >> 5) & 1);
          auVar129._20_4_ = (uint)bVar5 * auVar97._20_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar79 >> 6) & 1);
          auVar129._24_4_ = (uint)bVar5 * auVar97._24_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = SUB81(uVar79 >> 7,0);
          auVar129._28_4_ = (uint)bVar5 * auVar97._28_4_ | (uint)!bVar5 * -0x800000;
          auVar235._8_4_ = 0x7fffffff;
          auVar235._0_8_ = 0x7fffffff7fffffff;
          auVar235._12_4_ = 0x7fffffff;
          auVar235._16_4_ = 0x7fffffff;
          auVar235._20_4_ = 0x7fffffff;
          auVar235._24_4_ = 0x7fffffff;
          auVar235._28_4_ = 0x7fffffff;
          auVar97 = vandps_avx(auVar235,local_640);
          auVar97 = vmaxps_avx(local_4a0,auVar97);
          auVar29._8_4_ = 0x36000000;
          auVar29._0_8_ = 0x3600000036000000;
          auVar29._12_4_ = 0x36000000;
          auVar29._16_4_ = 0x36000000;
          auVar29._20_4_ = 0x36000000;
          auVar29._24_4_ = 0x36000000;
          auVar29._28_4_ = 0x36000000;
          auVar98 = vmulps_avx512vl(auVar97,auVar29);
          auVar97 = vandps_avx(auVar102,auVar235);
          uVar75 = vcmpps_avx512vl(auVar97,auVar98,1);
          uVar79 = uVar79 & uVar75;
          bVar71 = (byte)uVar79;
          if (bVar71 != 0) {
            uVar75 = vcmpps_avx512vl(auVar95,ZEXT1632(auVar83),2);
            auVar236._8_4_ = 0xff800000;
            auVar236._0_8_ = 0xff800000ff800000;
            auVar236._12_4_ = 0xff800000;
            auVar236._16_4_ = 0xff800000;
            auVar236._20_4_ = 0xff800000;
            auVar236._24_4_ = 0xff800000;
            auVar236._28_4_ = 0xff800000;
            auVar241._8_4_ = 0x7f800000;
            auVar241._0_8_ = 0x7f8000007f800000;
            auVar241._12_4_ = 0x7f800000;
            auVar241._16_4_ = 0x7f800000;
            auVar241._20_4_ = 0x7f800000;
            auVar241._24_4_ = 0x7f800000;
            auVar241._28_4_ = 0x7f800000;
            auVar97 = vblendmps_avx512vl(auVar241,auVar236);
            bVar70 = (byte)uVar75;
            uVar73 = (uint)(bVar70 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar98._0_4_;
            bVar5 = (bool)((byte)(uVar75 >> 1) & 1);
            uVar137 = (uint)bVar5 * auVar97._4_4_ | (uint)!bVar5 * auVar98._4_4_;
            bVar5 = (bool)((byte)(uVar75 >> 2) & 1);
            uVar138 = (uint)bVar5 * auVar97._8_4_ | (uint)!bVar5 * auVar98._8_4_;
            bVar5 = (bool)((byte)(uVar75 >> 3) & 1);
            uVar139 = (uint)bVar5 * auVar97._12_4_ | (uint)!bVar5 * auVar98._12_4_;
            bVar5 = (bool)((byte)(uVar75 >> 4) & 1);
            uVar140 = (uint)bVar5 * auVar97._16_4_ | (uint)!bVar5 * auVar98._16_4_;
            bVar5 = (bool)((byte)(uVar75 >> 5) & 1);
            uVar141 = (uint)bVar5 * auVar97._20_4_ | (uint)!bVar5 * auVar98._20_4_;
            bVar5 = (bool)((byte)(uVar75 >> 6) & 1);
            uVar142 = (uint)bVar5 * auVar97._24_4_ | (uint)!bVar5 * auVar98._24_4_;
            bVar5 = SUB81(uVar75 >> 7,0);
            uVar143 = (uint)bVar5 * auVar97._28_4_ | (uint)!bVar5 * auVar98._28_4_;
            auVar128._0_4_ = (bVar71 & 1) * uVar73 | !(bool)(bVar71 & 1) * auVar128._0_4_;
            bVar5 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar128._4_4_ = bVar5 * uVar137 | !bVar5 * auVar128._4_4_;
            bVar5 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar128._8_4_ = bVar5 * uVar138 | !bVar5 * auVar128._8_4_;
            bVar5 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar128._12_4_ = bVar5 * uVar139 | !bVar5 * auVar128._12_4_;
            bVar5 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar128._16_4_ = bVar5 * uVar140 | !bVar5 * auVar128._16_4_;
            bVar5 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar128._20_4_ = bVar5 * uVar141 | !bVar5 * auVar128._20_4_;
            bVar5 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar128._24_4_ = bVar5 * uVar142 | !bVar5 * auVar128._24_4_;
            bVar5 = SUB81(uVar79 >> 7,0);
            auVar128._28_4_ = bVar5 * uVar143 | !bVar5 * auVar128._28_4_;
            auVar97 = vblendmps_avx512vl(auVar236,auVar241);
            bVar5 = (bool)((byte)(uVar75 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar75 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar75 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar75 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar75 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar75 >> 6) & 1);
            bVar11 = SUB81(uVar75 >> 7,0);
            auVar129._0_4_ =
                 (uint)(bVar71 & 1) *
                 ((uint)(bVar70 & 1) * auVar97._0_4_ | !(bool)(bVar70 & 1) * uVar73) |
                 !(bool)(bVar71 & 1) * auVar129._0_4_;
            bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
            auVar129._4_4_ =
                 (uint)bVar78 * ((uint)bVar5 * auVar97._4_4_ | !bVar5 * uVar137) |
                 !bVar78 * auVar129._4_4_;
            bVar5 = (bool)((byte)(uVar79 >> 2) & 1);
            auVar129._8_4_ =
                 (uint)bVar5 * ((uint)bVar6 * auVar97._8_4_ | !bVar6 * uVar138) |
                 !bVar5 * auVar129._8_4_;
            bVar5 = (bool)((byte)(uVar79 >> 3) & 1);
            auVar129._12_4_ =
                 (uint)bVar5 * ((uint)bVar7 * auVar97._12_4_ | !bVar7 * uVar139) |
                 !bVar5 * auVar129._12_4_;
            bVar5 = (bool)((byte)(uVar79 >> 4) & 1);
            auVar129._16_4_ =
                 (uint)bVar5 * ((uint)bVar8 * auVar97._16_4_ | !bVar8 * uVar140) |
                 !bVar5 * auVar129._16_4_;
            bVar5 = (bool)((byte)(uVar79 >> 5) & 1);
            auVar129._20_4_ =
                 (uint)bVar5 * ((uint)bVar9 * auVar97._20_4_ | !bVar9 * uVar141) |
                 !bVar5 * auVar129._20_4_;
            bVar5 = (bool)((byte)(uVar79 >> 6) & 1);
            auVar129._24_4_ =
                 (uint)bVar5 * ((uint)bVar10 * auVar97._24_4_ | !bVar10 * uVar142) |
                 !bVar5 * auVar129._24_4_;
            bVar5 = SUB81(uVar79 >> 7,0);
            auVar129._28_4_ =
                 (uint)bVar5 * ((uint)bVar11 * auVar97._28_4_ | !bVar11 * uVar143) |
                 !bVar5 * auVar129._28_4_;
            bVar74 = (~bVar71 | bVar70) & bVar74;
          }
        }
        auVar239._8_4_ = 0x7fffffff;
        auVar239._0_8_ = 0x7fffffff7fffffff;
        auVar239._12_4_ = 0x7fffffff;
        auVar246 = ZEXT3264(local_8a0);
        auVar245 = ZEXT3264(local_880);
        auVar94 = vmulps_avx512vl(local_800,auVar94);
        auVar96 = vfmadd231ps_avx512vl(auVar94,local_8a0,auVar96);
        auVar96 = vfmadd231ps_avx512vl(auVar96,local_880,auVar100);
        _local_1c0 = _local_680;
        local_1a0 = vminps_avx(local_460,auVar128);
        auVar227._8_4_ = 0x7fffffff;
        auVar227._0_8_ = 0x7fffffff7fffffff;
        auVar227._12_4_ = 0x7fffffff;
        auVar227._16_4_ = 0x7fffffff;
        auVar227._20_4_ = 0x7fffffff;
        auVar227._24_4_ = 0x7fffffff;
        auVar227._28_4_ = 0x7fffffff;
        auVar96 = vandps_avx(auVar96,auVar227);
        auVar219 = ZEXT3264(auVar96);
        _local_480 = vmaxps_avx(_local_680,auVar129);
        auVar202._8_4_ = 0x3e99999a;
        auVar202._0_8_ = 0x3e99999a3e99999a;
        auVar202._12_4_ = 0x3e99999a;
        auVar202._16_4_ = 0x3e99999a;
        auVar202._20_4_ = 0x3e99999a;
        auVar202._24_4_ = 0x3e99999a;
        auVar202._28_4_ = 0x3e99999a;
        uVar13 = vcmpps_avx512vl(auVar96,auVar202,1);
        local_8ac = (undefined4)uVar13;
        uVar13 = vcmpps_avx512vl(_local_680,local_1a0,2);
        bVar71 = (byte)uVar13 & bVar69;
        _local_540 = _local_480;
        uVar14 = vcmpps_avx512vl(_local_480,local_460,2);
        if ((bVar69 & ((byte)uVar14 | (byte)uVar13)) == 0) {
          auVar212 = ZEXT3264(_DAT_02020f20);
        }
        else {
          auVar96 = vmulps_avx512vl(local_800,auVar101);
          auVar96 = vfmadd213ps_avx512vl(auVar105,local_8a0,auVar96);
          auVar96 = vfmadd213ps_avx512vl(auVar104,local_880,auVar96);
          auVar96 = vandps_avx(auVar96,auVar227);
          uVar13 = vcmpps_avx512vl(auVar96,auVar202,1);
          local_8b4 = (uint)(byte)~bVar74;
          bVar74 = (byte)uVar13 | ~bVar74;
          auVar159._8_4_ = 2;
          auVar159._0_8_ = 0x200000002;
          auVar159._12_4_ = 2;
          auVar159._16_4_ = 2;
          auVar159._20_4_ = 2;
          auVar159._24_4_ = 2;
          auVar159._28_4_ = 2;
          auVar30._8_4_ = 3;
          auVar30._0_8_ = 0x300000003;
          auVar30._12_4_ = 3;
          auVar30._16_4_ = 3;
          auVar30._20_4_ = 3;
          auVar30._24_4_ = 3;
          auVar30._28_4_ = 3;
          auVar96 = vpblendmd_avx512vl(auVar159,auVar30);
          local_440._0_4_ = (uint)(bVar74 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar74 & 1) * 2;
          bVar5 = (bool)(bVar74 >> 1 & 1);
          local_440._4_4_ = (uint)bVar5 * auVar96._4_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar74 >> 2 & 1);
          local_440._8_4_ = (uint)bVar5 * auVar96._8_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar74 >> 3 & 1);
          local_440._12_4_ = (uint)bVar5 * auVar96._12_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar74 >> 4 & 1);
          local_440._16_4_ = (uint)bVar5 * auVar96._16_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar74 >> 5 & 1);
          local_440._20_4_ = (uint)bVar5 * auVar96._20_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar74 >> 6 & 1);
          local_440._24_4_ = (uint)bVar5 * auVar96._24_4_ | (uint)!bVar5 * 2;
          local_440._28_4_ = (uint)(bVar74 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar74 >> 7) * 2;
          local_4c0 = vpbroadcastd_avx512vl();
          uVar13 = vpcmpd_avx512vl(local_4c0,local_440,5);
          local_8b0 = (uint)bVar71;
          bVar71 = (byte)uVar13 & bVar71;
          if (bVar71 != 0) {
            auVar83 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar82 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar84 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
            auVar85 = vminps_avx(auVar83,auVar84);
            auVar83 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
            auVar84 = vmaxps_avx(auVar82,auVar83);
            auVar82 = vandps_avx(auVar239,auVar85);
            auVar83 = vandps_avx(auVar239,auVar84);
            auVar82 = vmaxps_avx(auVar82,auVar83);
            auVar83 = vmovshdup_avx(auVar82);
            auVar83 = vmaxss_avx(auVar83,auVar82);
            auVar82 = vshufpd_avx(auVar82,auVar82,1);
            auVar82 = vmaxss_avx(auVar82,auVar83);
            fVar144 = auVar82._0_4_ * 1.9073486e-06;
            local_770 = vshufps_avx(auVar84,auVar84,0xff);
            local_520 = (float)local_680._0_4_ + (float)local_660._0_4_;
            fStack_51c = (float)local_680._4_4_ + (float)local_660._4_4_;
            fStack_518 = fStack_678 + fStack_658;
            fStack_514 = fStack_674 + fStack_654;
            fStack_510 = fStack_670 + fStack_650;
            fStack_50c = fStack_66c + fStack_64c;
            fStack_508 = fStack_668 + fStack_648;
            fStack_504 = fStack_664 + fStack_644;
            do {
              auVar160._8_4_ = 0x7f800000;
              auVar160._0_8_ = 0x7f8000007f800000;
              auVar160._12_4_ = 0x7f800000;
              auVar160._16_4_ = 0x7f800000;
              auVar160._20_4_ = 0x7f800000;
              auVar160._24_4_ = 0x7f800000;
              auVar160._28_4_ = 0x7f800000;
              auVar96 = vblendmps_avx512vl(auVar160,_local_680);
              auVar130._0_4_ =
                   (uint)(bVar71 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar71 & 1) * 0x7f800000;
              bVar5 = (bool)(bVar71 >> 1 & 1);
              auVar130._4_4_ = (uint)bVar5 * auVar96._4_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar71 >> 2 & 1);
              auVar130._8_4_ = (uint)bVar5 * auVar96._8_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar71 >> 3 & 1);
              auVar130._12_4_ = (uint)bVar5 * auVar96._12_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar71 >> 4 & 1);
              auVar130._16_4_ = (uint)bVar5 * auVar96._16_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar71 >> 5 & 1);
              auVar130._20_4_ = (uint)bVar5 * auVar96._20_4_ | (uint)!bVar5 * 0x7f800000;
              auVar130._24_4_ =
                   (uint)(bVar71 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar71 >> 6) * 0x7f800000;
              auVar130._28_4_ = 0x7f800000;
              auVar96 = vshufps_avx(auVar130,auVar130,0xb1);
              auVar96 = vminps_avx(auVar130,auVar96);
              auVar94 = vshufpd_avx(auVar96,auVar96,5);
              auVar96 = vminps_avx(auVar96,auVar94);
              auVar94 = vpermpd_avx2(auVar96,0x4e);
              auVar96 = vminps_avx(auVar96,auVar94);
              uVar13 = vcmpps_avx512vl(auVar130,auVar96,0);
              bVar70 = (byte)uVar13 & bVar71;
              bVar74 = bVar71;
              if (bVar70 != 0) {
                bVar74 = bVar70;
              }
              iVar16 = 0;
              for (uVar73 = (uint)bVar74; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                iVar16 = iVar16 + 1;
              }
              fVar228 = *(float *)(local_4e0 + (uint)(iVar16 << 2));
              fVar229 = *(float *)(local_1c0 + (uint)(iVar16 << 2));
              fVar231 = local_8a8;
              if ((float)local_790._0_4_ < 0.0) {
                fVar231 = sqrtf((float)local_790._0_4_);
              }
              lVar77 = 4;
              do {
                auVar145._4_4_ = fVar229;
                auVar145._0_4_ = fVar229;
                auVar145._8_4_ = fVar229;
                auVar145._12_4_ = fVar229;
                auVar83 = vfmadd132ps_fma(auVar145,ZEXT816(0) << 0x40,local_780);
                fVar238 = 1.0 - fVar228;
                auVar188._0_4_ = local_6e0._0_4_ * fVar228;
                auVar188._4_4_ = local_6e0._4_4_ * fVar228;
                auVar188._8_4_ = local_6e0._8_4_ * fVar228;
                auVar188._12_4_ = local_6e0._12_4_ * fVar228;
                local_710 = ZEXT416((uint)fVar238);
                auVar209._4_4_ = fVar238;
                auVar209._0_4_ = fVar238;
                auVar209._8_4_ = fVar238;
                auVar209._12_4_ = fVar238;
                auVar82 = vfmadd231ps_fma(auVar188,auVar209,local_6a0._0_16_);
                auVar213._0_4_ = local_6c0._0_4_ * fVar228;
                auVar213._4_4_ = local_6c0._4_4_ * fVar228;
                auVar213._8_4_ = local_6c0._8_4_ * fVar228;
                auVar213._12_4_ = local_6c0._12_4_ * fVar228;
                auVar84 = vfmadd231ps_fma(auVar213,auVar209,local_6e0._0_16_);
                auVar220._0_4_ = fVar228 * (float)local_700._0_4_;
                auVar220._4_4_ = fVar228 * (float)local_700._4_4_;
                auVar220._8_4_ = fVar228 * fStack_6f8;
                auVar220._12_4_ = fVar228 * fStack_6f4;
                auVar85 = vfmadd231ps_fma(auVar220,auVar209,local_6c0._0_16_);
                auVar225._0_4_ = fVar228 * auVar84._0_4_;
                auVar225._4_4_ = fVar228 * auVar84._4_4_;
                auVar225._8_4_ = fVar228 * auVar84._8_4_;
                auVar225._12_4_ = fVar228 * auVar84._12_4_;
                auVar82 = vfmadd231ps_fma(auVar225,auVar209,auVar82);
                auVar189._0_4_ = fVar228 * auVar85._0_4_;
                auVar189._4_4_ = fVar228 * auVar85._4_4_;
                auVar189._8_4_ = fVar228 * auVar85._8_4_;
                auVar189._12_4_ = fVar228 * auVar85._12_4_;
                auVar84 = vfmadd231ps_fma(auVar189,auVar209,auVar84);
                auVar214._0_4_ = fVar228 * auVar84._0_4_;
                auVar214._4_4_ = fVar228 * auVar84._4_4_;
                auVar214._8_4_ = fVar228 * auVar84._8_4_;
                auVar214._12_4_ = fVar228 * auVar84._12_4_;
                auVar85 = vfmadd231ps_fma(auVar214,auVar82,auVar209);
                auVar82 = vsubps_avx(auVar84,auVar82);
                auVar17._8_4_ = 0x40400000;
                auVar17._0_8_ = 0x4040000040400000;
                auVar17._12_4_ = 0x40400000;
                auVar84 = vmulps_avx512vl(auVar82,auVar17);
                local_640._0_16_ = auVar85;
                auVar82 = vsubps_avx(auVar83,auVar85);
                local_7c0._0_16_ = auVar82;
                auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
                local_7e0._0_16_ = auVar82;
                local_920 = ZEXT416((uint)fVar228);
                if (auVar82._0_4_ < 0.0) {
                  auVar219._0_4_ = sqrtf(auVar82._0_4_);
                  auVar219._4_60_ = extraout_var;
                  auVar82 = auVar219._0_16_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar82,auVar82);
                }
                local_720 = vdpps_avx(auVar84,auVar84,0x7f);
                fVar238 = local_720._0_4_;
                auVar190._4_12_ = ZEXT812(0) << 0x20;
                auVar190._0_4_ = fVar238;
                auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
                fVar165 = auVar83._0_4_;
                local_730 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar190);
                auVar18._8_4_ = 0x80000000;
                auVar18._0_8_ = 0x8000000080000000;
                auVar18._12_4_ = 0x80000000;
                auVar85 = vxorps_avx512vl(local_720,auVar18);
                auVar83 = vfnmadd213ss_fma(local_730,local_720,ZEXT416(0x40000000));
                uVar73 = auVar82._0_4_;
                if (fVar238 < auVar85._0_4_) {
                  auVar244._0_4_ = sqrtf(fVar238);
                  auVar244._4_60_ = extraout_var_00;
                  auVar82 = ZEXT416(uVar73);
                  auVar85 = auVar244._0_16_;
                }
                else {
                  auVar85 = vsqrtss_avx512f(local_720,local_720);
                }
                fVar238 = fVar165 * 1.5 + fVar238 * -0.5 * fVar165 * fVar165 * fVar165;
                auVar146._0_4_ = auVar84._0_4_ * fVar238;
                auVar146._4_4_ = auVar84._4_4_ * fVar238;
                auVar146._8_4_ = auVar84._8_4_ * fVar238;
                auVar146._12_4_ = auVar84._12_4_ * fVar238;
                auVar80 = vdpps_avx(local_7c0._0_16_,auVar146,0x7f);
                fVar206 = auVar82._0_4_;
                fVar165 = auVar80._0_4_;
                auVar147._0_4_ = fVar165 * fVar165;
                auVar147._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                auVar147._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                auVar147._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                auVar86 = vsubps_avx512vl(local_7e0._0_16_,auVar147);
                fVar233 = auVar86._0_4_;
                auVar167._4_12_ = ZEXT812(0) << 0x20;
                auVar167._0_4_ = fVar233;
                auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
                auVar81 = vmulss_avx512f(auVar87,ZEXT416(0x3fc00000));
                auVar88 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
                if (fVar233 < 0.0) {
                  local_750 = fVar238;
                  fStack_74c = fVar238;
                  fStack_748 = fVar238;
                  fStack_744 = fVar238;
                  local_740 = auVar87;
                  fVar233 = sqrtf(fVar233);
                  auVar88 = ZEXT416(auVar88._0_4_);
                  auVar81 = ZEXT416(auVar81._0_4_);
                  auVar85 = ZEXT416(auVar85._0_4_);
                  auVar82 = ZEXT416(uVar73);
                  auVar87 = local_740;
                  fVar238 = local_750;
                  fVar234 = fStack_74c;
                  fVar230 = fStack_748;
                  fVar232 = fStack_744;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                  fVar233 = auVar86._0_4_;
                  fVar234 = fVar238;
                  fVar230 = fVar238;
                  fVar232 = fVar238;
                }
                auVar239._8_4_ = 0x7fffffff;
                auVar239._0_8_ = 0x7fffffff7fffffff;
                auVar239._12_4_ = 0x7fffffff;
                auVar245 = ZEXT3264(local_880);
                auVar246 = ZEXT3264(local_8a0);
                auVar244 = ZEXT3264(local_800);
                auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920,local_710);
                fVar166 = auVar86._0_4_ * 6.0;
                fVar12 = fVar228 * 6.0;
                auVar191._0_4_ = fVar12 * (float)local_700._0_4_;
                auVar191._4_4_ = fVar12 * (float)local_700._4_4_;
                auVar191._8_4_ = fVar12 * fStack_6f8;
                auVar191._12_4_ = fVar12 * fStack_6f4;
                auVar168._4_4_ = fVar166;
                auVar168._0_4_ = fVar166;
                auVar168._8_4_ = fVar166;
                auVar168._12_4_ = fVar166;
                auVar86 = vfmadd132ps_fma(auVar168,auVar191,local_6c0._0_16_);
                auVar90 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_710,local_920);
                fVar166 = auVar90._0_4_ * 6.0;
                auVar192._4_4_ = fVar166;
                auVar192._0_4_ = fVar166;
                auVar192._8_4_ = fVar166;
                auVar192._12_4_ = fVar166;
                auVar86 = vfmadd132ps_fma(auVar192,auVar86,local_6e0._0_16_);
                fVar166 = local_710._0_4_ * 6.0;
                auVar169._4_4_ = fVar166;
                auVar169._0_4_ = fVar166;
                auVar169._8_4_ = fVar166;
                auVar169._12_4_ = fVar166;
                auVar86 = vfmadd132ps_fma(auVar169,auVar86,local_6a0._0_16_);
                auVar193._0_4_ = auVar86._0_4_ * (float)local_720._0_4_;
                auVar193._4_4_ = auVar86._4_4_ * (float)local_720._0_4_;
                auVar193._8_4_ = auVar86._8_4_ * (float)local_720._0_4_;
                auVar193._12_4_ = auVar86._12_4_ * (float)local_720._0_4_;
                auVar86 = vdpps_avx(auVar84,auVar86,0x7f);
                fVar166 = auVar86._0_4_;
                auVar170._0_4_ = auVar84._0_4_ * fVar166;
                auVar170._4_4_ = auVar84._4_4_ * fVar166;
                auVar170._8_4_ = auVar84._8_4_ * fVar166;
                auVar170._12_4_ = auVar84._12_4_ * fVar166;
                auVar86 = vsubps_avx(auVar193,auVar170);
                fVar166 = auVar83._0_4_ * (float)local_730._0_4_;
                auVar19._8_4_ = 0x80000000;
                auVar19._0_8_ = 0x8000000080000000;
                auVar19._12_4_ = 0x80000000;
                auVar132._16_16_ = local_800._16_16_;
                auVar89 = vxorps_avx512vl(auVar84,auVar19);
                auVar215._0_4_ = fVar238 * auVar86._0_4_ * fVar166;
                auVar215._4_4_ = fVar234 * auVar86._4_4_ * fVar166;
                auVar215._8_4_ = fVar230 * auVar86._8_4_ * fVar166;
                auVar215._12_4_ = fVar232 * auVar86._12_4_ * fVar166;
                auVar83 = vdpps_avx(auVar89,auVar146,0x7f);
                auVar86 = vmaxss_avx(ZEXT416((uint)fVar144),
                                     ZEXT416((uint)(fVar229 * fVar231 * 1.9073486e-06)));
                auVar90 = vdivss_avx512f(ZEXT416((uint)fVar144),auVar85);
                auVar85 = vdpps_avx(local_7c0._0_16_,auVar215,0x7f);
                auVar82 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar144),auVar86);
                auVar90 = vfmadd213ss_fma(ZEXT416((uint)(fVar206 + 1.0)),auVar90,auVar82);
                auVar82 = vdpps_avx(local_780,auVar146,0x7f);
                fVar238 = auVar83._0_4_ + auVar85._0_4_;
                auVar83 = vdpps_avx(local_7c0._0_16_,auVar89,0x7f);
                auVar88 = vmulss_avx512f(auVar88,auVar87);
                auVar87 = vmulss_avx512f(auVar87,auVar87);
                auVar85 = vdpps_avx(local_7c0._0_16_,local_780,0x7f);
                auVar88 = vaddss_avx512f(auVar81,ZEXT416((uint)(auVar88._0_4_ * auVar87._0_4_)));
                auVar87 = vfnmadd231ss_fma(auVar83,auVar80,ZEXT416((uint)fVar238));
                auVar81 = vfnmadd231ss_fma(auVar85,auVar80,auVar82);
                auVar83 = vpermilps_avx(local_640._0_16_,0xff);
                fVar233 = fVar233 - auVar83._0_4_;
                auVar83 = vshufps_avx(auVar84,auVar84,0xff);
                auVar85 = vfmsub213ss_fma(auVar87,auVar88,auVar83);
                fVar206 = auVar81._0_4_ * auVar88._0_4_;
                auVar87 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar85._0_4_)),
                                          ZEXT416((uint)fVar238),ZEXT416((uint)fVar206));
                fVar234 = auVar87._0_4_;
                fVar238 = fVar233 * (fVar238 / fVar234) - fVar165 * (auVar85._0_4_ / fVar234);
                auVar219 = ZEXT464((uint)fVar238);
                fVar228 = fVar228 - (fVar165 * (fVar206 / fVar234) -
                                    fVar233 * (auVar82._0_4_ / fVar234));
                fVar229 = fVar229 - fVar238;
                auVar82 = vandps_avx(auVar80,auVar239);
                if (auVar90._0_4_ <= auVar82._0_4_) {
LAB_01de35bd:
                  bVar5 = false;
                }
                else {
                  auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar90._0_4_ + auVar86._0_4_)),local_770
                                            ,ZEXT416(0x36000000));
                  auVar82 = vandps_avx(auVar239,ZEXT416((uint)fVar233));
                  if (auVar85._0_4_ <= auVar82._0_4_) goto LAB_01de35bd;
                  fVar229 = fVar229 + (float)local_760._0_4_;
                  bVar5 = true;
                  if (fVar207 <= fVar229) {
                    fVar238 = *(float *)(ray + k * 4 + 0x80);
                    auVar219 = ZEXT464((uint)fVar238);
                    if (((fVar229 <= fVar238) && (0.0 <= fVar228)) && (fVar228 <= 1.0)) {
                      auVar132._0_16_ = ZEXT816(0) << 0x20;
                      auVar131._4_28_ = auVar132._4_28_;
                      auVar131._0_4_ = local_7e0._0_4_;
                      auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar131._0_16_);
                      fVar165 = auVar82._0_4_;
                      auVar82 = vmulss_avx512f(local_7e0._0_16_,ZEXT416(0xbf000000));
                      pGVar3 = (context->scene->geometries).items[uVar76].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        fVar165 = fVar165 * 1.5 + auVar82._0_4_ * fVar165 * fVar165 * fVar165;
                        auVar171._0_4_ = local_7c0._0_4_ * fVar165;
                        auVar171._4_4_ = local_7c0._4_4_ * fVar165;
                        auVar171._8_4_ = local_7c0._8_4_ * fVar165;
                        auVar171._12_4_ = local_7c0._12_4_ * fVar165;
                        auVar85 = vfmadd213ps_fma(auVar83,auVar171,auVar84);
                        auVar82 = vshufps_avx(auVar171,auVar171,0xc9);
                        auVar83 = vshufps_avx(auVar84,auVar84,0xc9);
                        auVar172._0_4_ = auVar171._0_4_ * auVar83._0_4_;
                        auVar172._4_4_ = auVar171._4_4_ * auVar83._4_4_;
                        auVar172._8_4_ = auVar171._8_4_ * auVar83._8_4_;
                        auVar172._12_4_ = auVar171._12_4_ * auVar83._12_4_;
                        auVar84 = vfmsub231ps_fma(auVar172,auVar84,auVar82);
                        auVar82 = vshufps_avx(auVar84,auVar84,0xc9);
                        auVar83 = vshufps_avx(auVar85,auVar85,0xc9);
                        auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                        auVar148._0_4_ = auVar85._0_4_ * auVar84._0_4_;
                        auVar148._4_4_ = auVar85._4_4_ * auVar84._4_4_;
                        auVar148._8_4_ = auVar85._8_4_ * auVar84._8_4_;
                        auVar148._12_4_ = auVar85._12_4_ * auVar84._12_4_;
                        auVar82 = vfmsub231ps_fma(auVar148,auVar82,auVar83);
                        uVar208 = auVar82._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar229;
                          uVar2 = vextractps_avx(auVar82,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                          uVar2 = vextractps_avx(auVar82,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = uVar208;
                          *(float *)(ray + k * 4 + 0xf0) = fVar228;
                          *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                          *(int *)(ray + k * 4 + 0x110) = (int)local_8c0;
                          *(uint *)(ray + k * 4 + 0x120) = uVar76;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_5e0 = (RTCHitN  [16])vshufps_avx(auVar82,auVar82,0x55);
                          auStack_5d0 = vshufps_avx(auVar82,auVar82,0xaa);
                          local_5c0 = uVar208;
                          uStack_5bc = uVar208;
                          uStack_5b8 = uVar208;
                          uStack_5b4 = uVar208;
                          local_5b0 = fVar228;
                          fStack_5ac = fVar228;
                          fStack_5a8 = fVar228;
                          fStack_5a4 = fVar228;
                          local_5a0 = ZEXT416(0) << 0x20;
                          local_590 = local_600._0_8_;
                          uStack_588 = local_600._8_8_;
                          local_580 = local_5f0;
                          vpcmpeqd_avx2(ZEXT1632(local_5f0),ZEXT1632(local_5f0));
                          uStack_56c = context->user->instID[0];
                          local_570 = uStack_56c;
                          uStack_568 = uStack_56c;
                          uStack_564 = uStack_56c;
                          uStack_560 = context->user->instPrimID[0];
                          uStack_55c = uStack_560;
                          uStack_558 = uStack_560;
                          uStack_554 = uStack_560;
                          *(float *)(ray + k * 4 + 0x80) = fVar229;
                          local_8d0 = local_610._0_8_;
                          uStack_8c8 = local_610._8_8_;
                          local_860.valid = (int *)&local_8d0;
                          local_860.geometryUserPtr = pGVar3->userPtr;
                          local_860.context = context->user;
                          local_860.hit = local_5e0;
                          local_860.N = 4;
                          local_860.ray = (RTCRayN *)ray;
                          if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar3->intersectionFilterN)(&local_860);
                            auVar244 = ZEXT3264(local_800);
                            auVar246 = ZEXT3264(local_8a0);
                            auVar245 = ZEXT3264(local_880);
                            auVar239._8_4_ = 0x7fffffff;
                            auVar239._0_8_ = 0x7fffffff7fffffff;
                            auVar239._12_4_ = 0x7fffffff;
                          }
                          auVar59._8_8_ = uStack_8c8;
                          auVar59._0_8_ = local_8d0;
                          uVar79 = vptestmd_avx512vl(auVar59,auVar59);
                          if ((uVar79 & 0xf) == 0) {
LAB_01de386a:
                            *(float *)(ray + k * 4 + 0x80) = fVar238;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var4)(&local_860);
                              auVar244 = ZEXT3264(local_800);
                              auVar246 = ZEXT3264(local_8a0);
                              auVar245 = ZEXT3264(local_880);
                              auVar239._8_4_ = 0x7fffffff;
                              auVar239._0_8_ = 0x7fffffff7fffffff;
                              auVar239._12_4_ = 0x7fffffff;
                            }
                            auVar60._8_8_ = uStack_8c8;
                            auVar60._0_8_ = local_8d0;
                            uVar79 = vptestmd_avx512vl(auVar60,auVar60);
                            uVar79 = uVar79 & 0xf;
                            bVar74 = (byte)uVar79;
                            if (bVar74 == 0) goto LAB_01de386a;
                            iVar56 = *(int *)(local_860.hit + 4);
                            iVar57 = *(int *)(local_860.hit + 8);
                            iVar58 = *(int *)(local_860.hit + 0xc);
                            bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
                            bVar7 = SUB81(uVar79 >> 3,0);
                            *(uint *)(local_860.ray + 0xc0) =
                                 (uint)(bVar74 & 1) * *(int *)local_860.hit |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_860.ray + 0xc0);
                            *(uint *)(local_860.ray + 0xc4) =
                                 (uint)bVar78 * iVar56 |
                                 (uint)!bVar78 * *(int *)(local_860.ray + 0xc4);
                            *(uint *)(local_860.ray + 200) =
                                 (uint)bVar6 * iVar57 | (uint)!bVar6 * *(int *)(local_860.ray + 200)
                            ;
                            *(uint *)(local_860.ray + 0xcc) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xcc);
                            iVar56 = *(int *)(local_860.hit + 0x14);
                            iVar57 = *(int *)(local_860.hit + 0x18);
                            iVar58 = *(int *)(local_860.hit + 0x1c);
                            bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
                            bVar7 = SUB81(uVar79 >> 3,0);
                            *(uint *)(local_860.ray + 0xd0) =
                                 (uint)(bVar74 & 1) * *(int *)(local_860.hit + 0x10) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_860.ray + 0xd0);
                            *(uint *)(local_860.ray + 0xd4) =
                                 (uint)bVar78 * iVar56 |
                                 (uint)!bVar78 * *(int *)(local_860.ray + 0xd4);
                            *(uint *)(local_860.ray + 0xd8) =
                                 (uint)bVar6 * iVar57 |
                                 (uint)!bVar6 * *(int *)(local_860.ray + 0xd8);
                            *(uint *)(local_860.ray + 0xdc) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xdc);
                            iVar56 = *(int *)(local_860.hit + 0x24);
                            iVar57 = *(int *)(local_860.hit + 0x28);
                            iVar58 = *(int *)(local_860.hit + 0x2c);
                            bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
                            bVar7 = SUB81(uVar79 >> 3,0);
                            *(uint *)(local_860.ray + 0xe0) =
                                 (uint)(bVar74 & 1) * *(int *)(local_860.hit + 0x20) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_860.ray + 0xe0);
                            *(uint *)(local_860.ray + 0xe4) =
                                 (uint)bVar78 * iVar56 |
                                 (uint)!bVar78 * *(int *)(local_860.ray + 0xe4);
                            *(uint *)(local_860.ray + 0xe8) =
                                 (uint)bVar6 * iVar57 |
                                 (uint)!bVar6 * *(int *)(local_860.ray + 0xe8);
                            *(uint *)(local_860.ray + 0xec) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xec);
                            iVar56 = *(int *)(local_860.hit + 0x34);
                            iVar57 = *(int *)(local_860.hit + 0x38);
                            iVar58 = *(int *)(local_860.hit + 0x3c);
                            bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
                            bVar7 = SUB81(uVar79 >> 3,0);
                            *(uint *)(local_860.ray + 0xf0) =
                                 (uint)(bVar74 & 1) * *(int *)(local_860.hit + 0x30) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_860.ray + 0xf0);
                            *(uint *)(local_860.ray + 0xf4) =
                                 (uint)bVar78 * iVar56 |
                                 (uint)!bVar78 * *(int *)(local_860.ray + 0xf4);
                            *(uint *)(local_860.ray + 0xf8) =
                                 (uint)bVar6 * iVar57 |
                                 (uint)!bVar6 * *(int *)(local_860.ray + 0xf8);
                            *(uint *)(local_860.ray + 0xfc) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xfc);
                            iVar56 = *(int *)(local_860.hit + 0x44);
                            iVar57 = *(int *)(local_860.hit + 0x48);
                            iVar58 = *(int *)(local_860.hit + 0x4c);
                            bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
                            bVar7 = SUB81(uVar79 >> 3,0);
                            *(uint *)(local_860.ray + 0x100) =
                                 (uint)(bVar74 & 1) * *(int *)(local_860.hit + 0x40) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_860.ray + 0x100);
                            *(uint *)(local_860.ray + 0x104) =
                                 (uint)bVar78 * iVar56 |
                                 (uint)!bVar78 * *(int *)(local_860.ray + 0x104);
                            *(uint *)(local_860.ray + 0x108) =
                                 (uint)bVar6 * iVar57 |
                                 (uint)!bVar6 * *(int *)(local_860.ray + 0x108);
                            *(uint *)(local_860.ray + 0x10c) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0x10c);
                            auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x50));
                            *(undefined1 (*) [16])(local_860.ray + 0x110) = auVar82;
                            auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x60));
                            *(undefined1 (*) [16])(local_860.ray + 0x120) = auVar82;
                            auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x70));
                            *(undefined1 (*) [16])(local_860.ray + 0x130) = auVar82;
                            auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x80));
                            *(undefined1 (*) [16])(local_860.ray + 0x140) = auVar82;
                          }
                          auVar219 = ZEXT464((uint)fVar238);
                        }
                      }
                    }
                  }
                }
                bVar78 = lVar77 != 0;
                lVar77 = lVar77 + -1;
              } while ((!bVar5) && (bVar78));
              auVar63._4_4_ = fStack_51c;
              auVar63._0_4_ = local_520;
              auVar63._8_4_ = fStack_518;
              auVar63._12_4_ = fStack_514;
              auVar63._16_4_ = fStack_510;
              auVar63._20_4_ = fStack_50c;
              auVar63._24_4_ = fStack_508;
              auVar63._28_4_ = fStack_504;
              uVar208 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar31._4_4_ = uVar208;
              auVar31._0_4_ = uVar208;
              auVar31._8_4_ = uVar208;
              auVar31._12_4_ = uVar208;
              auVar31._16_4_ = uVar208;
              auVar31._20_4_ = uVar208;
              auVar31._24_4_ = uVar208;
              auVar31._28_4_ = uVar208;
              uVar13 = vcmpps_avx512vl(auVar63,auVar31,2);
              bVar71 = ~('\x01' << ((byte)iVar16 & 0x1f)) & bVar71 & (byte)uVar13;
            } while (bVar71 != 0);
          }
          auVar161._0_4_ = (float)local_540._0_4_ + (float)local_660._0_4_;
          auVar161._4_4_ = (float)local_540._4_4_ + (float)local_660._4_4_;
          auVar161._8_4_ = fStack_538 + fStack_658;
          auVar161._12_4_ = fStack_534 + fStack_654;
          auVar161._16_4_ = fStack_530 + fStack_650;
          auVar161._20_4_ = fStack_52c + fStack_64c;
          auVar161._24_4_ = fStack_528 + fStack_648;
          auVar161._28_4_ = fStack_524 + fStack_644;
          uVar208 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar32._4_4_ = uVar208;
          auVar32._0_4_ = uVar208;
          auVar32._8_4_ = uVar208;
          auVar32._12_4_ = uVar208;
          auVar32._16_4_ = uVar208;
          auVar32._20_4_ = uVar208;
          auVar32._24_4_ = uVar208;
          auVar32._28_4_ = uVar208;
          uVar13 = vcmpps_avx512vl(auVar161,auVar32,2);
          bVar74 = (byte)local_8ac | (byte)local_8b4;
          bVar69 = (byte)uVar14 & bVar69 & (byte)uVar13;
          auVar162._8_4_ = 2;
          auVar162._0_8_ = 0x200000002;
          auVar162._12_4_ = 2;
          auVar162._16_4_ = 2;
          auVar162._20_4_ = 2;
          auVar162._24_4_ = 2;
          auVar162._28_4_ = 2;
          auVar33._8_4_ = 3;
          auVar33._0_8_ = 0x300000003;
          auVar33._12_4_ = 3;
          auVar33._16_4_ = 3;
          auVar33._20_4_ = 3;
          auVar33._24_4_ = 3;
          auVar33._28_4_ = 3;
          auVar96 = vpblendmd_avx512vl(auVar162,auVar33);
          local_540._0_4_ = (uint)(bVar74 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar74 & 1) * 2;
          bVar5 = (bool)(bVar74 >> 1 & 1);
          local_540._4_4_ = (uint)bVar5 * auVar96._4_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar74 >> 2 & 1);
          fStack_538 = (float)((uint)bVar5 * auVar96._8_4_ | (uint)!bVar5 * 2);
          bVar5 = (bool)(bVar74 >> 3 & 1);
          fStack_534 = (float)((uint)bVar5 * auVar96._12_4_ | (uint)!bVar5 * 2);
          bVar5 = (bool)(bVar74 >> 4 & 1);
          fStack_530 = (float)((uint)bVar5 * auVar96._16_4_ | (uint)!bVar5 * 2);
          bVar5 = (bool)(bVar74 >> 5 & 1);
          fStack_52c = (float)((uint)bVar5 * auVar96._20_4_ | (uint)!bVar5 * 2);
          bVar5 = (bool)(bVar74 >> 6 & 1);
          fStack_528 = (float)((uint)bVar5 * auVar96._24_4_ | (uint)!bVar5 * 2);
          fStack_524 = (float)((uint)(bVar74 >> 7) * auVar96._28_4_ | (uint)!(bool)(bVar74 >> 7) * 2
                              );
          uVar13 = vpcmpd_avx512vl(_local_540,local_4c0,2);
          bVar74 = (byte)uVar13 & bVar69;
          if (bVar74 != 0) {
            auVar83 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar82 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar84 = vminps_avx(local_6c0._0_16_,local_700._0_16_);
            auVar85 = vminps_avx(auVar83,auVar84);
            auVar83 = vmaxps_avx(local_6c0._0_16_,local_700._0_16_);
            auVar84 = vmaxps_avx(auVar82,auVar83);
            auVar82 = vandps_avx(auVar239,auVar85);
            auVar83 = vandps_avx(auVar239,auVar84);
            auVar82 = vmaxps_avx(auVar82,auVar83);
            auVar83 = vmovshdup_avx(auVar82);
            auVar83 = vmaxss_avx(auVar83,auVar82);
            auVar82 = vshufpd_avx(auVar82,auVar82,1);
            auVar82 = vmaxss_avx(auVar82,auVar83);
            fVar144 = auVar82._0_4_ * 1.9073486e-06;
            local_770 = vshufps_avx(auVar84,auVar84,0xff);
            _local_680 = _local_480;
            local_520 = (float)local_480._0_4_ + (float)local_660._0_4_;
            fStack_51c = (float)local_480._4_4_ + (float)local_660._4_4_;
            fStack_518 = fStack_478 + fStack_658;
            fStack_514 = fStack_474 + fStack_654;
            fStack_510 = fStack_470 + fStack_650;
            fStack_50c = fStack_46c + fStack_64c;
            fStack_508 = fStack_468 + fStack_648;
            fStack_504 = fStack_464 + fStack_644;
            do {
              auVar163._8_4_ = 0x7f800000;
              auVar163._0_8_ = 0x7f8000007f800000;
              auVar163._12_4_ = 0x7f800000;
              auVar163._16_4_ = 0x7f800000;
              auVar163._20_4_ = 0x7f800000;
              auVar163._24_4_ = 0x7f800000;
              auVar163._28_4_ = 0x7f800000;
              auVar96 = vblendmps_avx512vl(auVar163,_local_680);
              auVar133._0_4_ =
                   (uint)(bVar74 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar74 & 1) * 0x7f800000;
              bVar5 = (bool)(bVar74 >> 1 & 1);
              auVar133._4_4_ = (uint)bVar5 * auVar96._4_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar74 >> 2 & 1);
              auVar133._8_4_ = (uint)bVar5 * auVar96._8_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar74 >> 3 & 1);
              auVar133._12_4_ = (uint)bVar5 * auVar96._12_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar74 >> 4 & 1);
              auVar133._16_4_ = (uint)bVar5 * auVar96._16_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar74 >> 5 & 1);
              auVar133._20_4_ = (uint)bVar5 * auVar96._20_4_ | (uint)!bVar5 * 0x7f800000;
              auVar133._24_4_ =
                   (uint)(bVar74 >> 6) * auVar96._24_4_ | (uint)!(bool)(bVar74 >> 6) * 0x7f800000;
              auVar133._28_4_ = 0x7f800000;
              auVar96 = vshufps_avx(auVar133,auVar133,0xb1);
              auVar96 = vminps_avx(auVar133,auVar96);
              auVar94 = vshufpd_avx(auVar96,auVar96,5);
              auVar96 = vminps_avx(auVar96,auVar94);
              auVar94 = vpermpd_avx2(auVar96,0x4e);
              auVar96 = vminps_avx(auVar96,auVar94);
              uVar13 = vcmpps_avx512vl(auVar133,auVar96,0);
              bVar70 = (byte)uVar13 & bVar74;
              bVar71 = bVar74;
              if (bVar70 != 0) {
                bVar71 = bVar70;
              }
              iVar16 = 0;
              for (uVar73 = (uint)bVar71; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                iVar16 = iVar16 + 1;
              }
              fVar228 = *(float *)(local_500 + (uint)(iVar16 << 2));
              fVar229 = *(float *)(local_460 + (uint)(iVar16 << 2));
              fVar231 = local_8a4;
              if ((float)local_790._0_4_ < 0.0) {
                fVar231 = sqrtf((float)local_790._0_4_);
              }
              lVar77 = 4;
              do {
                auVar149._4_4_ = fVar229;
                auVar149._0_4_ = fVar229;
                auVar149._8_4_ = fVar229;
                auVar149._12_4_ = fVar229;
                auVar83 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_780);
                fVar238 = 1.0 - fVar228;
                auVar194._0_4_ = local_6e0._0_4_ * fVar228;
                auVar194._4_4_ = local_6e0._4_4_ * fVar228;
                auVar194._8_4_ = local_6e0._8_4_ * fVar228;
                auVar194._12_4_ = local_6e0._12_4_ * fVar228;
                local_710 = ZEXT416((uint)fVar238);
                auVar210._4_4_ = fVar238;
                auVar210._0_4_ = fVar238;
                auVar210._8_4_ = fVar238;
                auVar210._12_4_ = fVar238;
                auVar82 = vfmadd231ps_fma(auVar194,auVar210,local_6a0._0_16_);
                auVar216._0_4_ = local_6c0._0_4_ * fVar228;
                auVar216._4_4_ = local_6c0._4_4_ * fVar228;
                auVar216._8_4_ = local_6c0._8_4_ * fVar228;
                auVar216._12_4_ = local_6c0._12_4_ * fVar228;
                auVar84 = vfmadd231ps_fma(auVar216,auVar210,local_6e0._0_16_);
                auVar221._0_4_ = fVar228 * (float)local_700._0_4_;
                auVar221._4_4_ = fVar228 * (float)local_700._4_4_;
                auVar221._8_4_ = fVar228 * fStack_6f8;
                auVar221._12_4_ = fVar228 * fStack_6f4;
                auVar85 = vfmadd231ps_fma(auVar221,auVar210,local_6c0._0_16_);
                auVar226._0_4_ = fVar228 * auVar84._0_4_;
                auVar226._4_4_ = fVar228 * auVar84._4_4_;
                auVar226._8_4_ = fVar228 * auVar84._8_4_;
                auVar226._12_4_ = fVar228 * auVar84._12_4_;
                auVar82 = vfmadd231ps_fma(auVar226,auVar210,auVar82);
                auVar195._0_4_ = fVar228 * auVar85._0_4_;
                auVar195._4_4_ = fVar228 * auVar85._4_4_;
                auVar195._8_4_ = fVar228 * auVar85._8_4_;
                auVar195._12_4_ = fVar228 * auVar85._12_4_;
                auVar84 = vfmadd231ps_fma(auVar195,auVar210,auVar84);
                auVar217._0_4_ = fVar228 * auVar84._0_4_;
                auVar217._4_4_ = fVar228 * auVar84._4_4_;
                auVar217._8_4_ = fVar228 * auVar84._8_4_;
                auVar217._12_4_ = fVar228 * auVar84._12_4_;
                auVar85 = vfmadd231ps_fma(auVar217,auVar82,auVar210);
                auVar82 = vsubps_avx(auVar84,auVar82);
                auVar20._8_4_ = 0x40400000;
                auVar20._0_8_ = 0x4040000040400000;
                auVar20._12_4_ = 0x40400000;
                auVar84 = vmulps_avx512vl(auVar82,auVar20);
                local_640._0_16_ = auVar85;
                auVar82 = vsubps_avx(auVar83,auVar85);
                local_7c0._0_16_ = auVar82;
                auVar82 = vdpps_avx(auVar82,auVar82,0x7f);
                local_7e0._0_16_ = auVar82;
                local_920 = ZEXT416((uint)fVar228);
                if (auVar82._0_4_ < 0.0) {
                  auVar245._0_4_ = sqrtf(auVar82._0_4_);
                  auVar245._4_60_ = extraout_var_01;
                  auVar82 = auVar245._0_16_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar82,auVar82);
                }
                local_720 = vdpps_avx(auVar84,auVar84,0x7f);
                fVar238 = local_720._0_4_;
                auVar196._4_12_ = ZEXT812(0) << 0x20;
                auVar196._0_4_ = fVar238;
                auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar196);
                fVar165 = auVar83._0_4_;
                local_730 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar196);
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar85 = vxorps_avx512vl(local_720,auVar21);
                auVar83 = vfnmadd213ss_fma(local_730,local_720,ZEXT416(0x40000000));
                uVar73 = auVar82._0_4_;
                if (fVar238 < auVar85._0_4_) {
                  auVar246._0_4_ = sqrtf(fVar238);
                  auVar246._4_60_ = extraout_var_02;
                  auVar82 = ZEXT416(uVar73);
                  auVar85 = auVar246._0_16_;
                }
                else {
                  auVar85 = vsqrtss_avx512f(local_720,local_720);
                }
                fVar238 = fVar165 * 1.5 + fVar238 * -0.5 * fVar165 * fVar165 * fVar165;
                auVar150._0_4_ = auVar84._0_4_ * fVar238;
                auVar150._4_4_ = auVar84._4_4_ * fVar238;
                auVar150._8_4_ = auVar84._8_4_ * fVar238;
                auVar150._12_4_ = auVar84._12_4_ * fVar238;
                auVar80 = vdpps_avx(local_7c0._0_16_,auVar150,0x7f);
                fVar206 = auVar82._0_4_;
                fVar165 = auVar80._0_4_;
                auVar151._0_4_ = fVar165 * fVar165;
                auVar151._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                auVar151._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                auVar151._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                auVar86 = vsubps_avx512vl(local_7e0._0_16_,auVar151);
                fVar233 = auVar86._0_4_;
                auVar173._4_12_ = ZEXT812(0) << 0x20;
                auVar173._0_4_ = fVar233;
                auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
                auVar81 = vmulss_avx512f(auVar87,ZEXT416(0x3fc00000));
                auVar88 = vmulss_avx512f(auVar86,ZEXT416(0xbf000000));
                if (fVar233 < 0.0) {
                  local_750 = fVar238;
                  fStack_74c = fVar238;
                  fStack_748 = fVar238;
                  fStack_744 = fVar238;
                  local_740 = auVar87;
                  fVar233 = sqrtf(fVar233);
                  auVar88 = ZEXT416(auVar88._0_4_);
                  auVar81 = ZEXT416(auVar81._0_4_);
                  auVar85 = ZEXT416(auVar85._0_4_);
                  auVar82 = ZEXT416(uVar73);
                  auVar87 = local_740;
                  fVar238 = local_750;
                  fVar234 = fStack_74c;
                  fVar230 = fStack_748;
                  fVar232 = fStack_744;
                }
                else {
                  auVar86 = vsqrtss_avx(auVar86,auVar86);
                  fVar233 = auVar86._0_4_;
                  fVar234 = fVar238;
                  fVar230 = fVar238;
                  fVar232 = fVar238;
                }
                auVar237._8_4_ = 0x7fffffff;
                auVar237._0_8_ = 0x7fffffff7fffffff;
                auVar237._12_4_ = 0x7fffffff;
                auVar245 = ZEXT3264(local_880);
                auVar246 = ZEXT3264(local_8a0);
                auVar244 = ZEXT3264(local_800);
                auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920,local_710);
                fVar166 = auVar86._0_4_ * 6.0;
                fVar12 = fVar228 * 6.0;
                auVar197._0_4_ = fVar12 * (float)local_700._0_4_;
                auVar197._4_4_ = fVar12 * (float)local_700._4_4_;
                auVar197._8_4_ = fVar12 * fStack_6f8;
                auVar197._12_4_ = fVar12 * fStack_6f4;
                auVar174._4_4_ = fVar166;
                auVar174._0_4_ = fVar166;
                auVar174._8_4_ = fVar166;
                auVar174._12_4_ = fVar166;
                auVar86 = vfmadd132ps_fma(auVar174,auVar197,local_6c0._0_16_);
                auVar90 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_710,local_920);
                fVar166 = auVar90._0_4_ * 6.0;
                auVar198._4_4_ = fVar166;
                auVar198._0_4_ = fVar166;
                auVar198._8_4_ = fVar166;
                auVar198._12_4_ = fVar166;
                auVar86 = vfmadd132ps_fma(auVar198,auVar86,local_6e0._0_16_);
                fVar166 = local_710._0_4_ * 6.0;
                auVar175._4_4_ = fVar166;
                auVar175._0_4_ = fVar166;
                auVar175._8_4_ = fVar166;
                auVar175._12_4_ = fVar166;
                auVar86 = vfmadd132ps_fma(auVar175,auVar86,local_6a0._0_16_);
                auVar199._0_4_ = auVar86._0_4_ * (float)local_720._0_4_;
                auVar199._4_4_ = auVar86._4_4_ * (float)local_720._0_4_;
                auVar199._8_4_ = auVar86._8_4_ * (float)local_720._0_4_;
                auVar199._12_4_ = auVar86._12_4_ * (float)local_720._0_4_;
                auVar86 = vdpps_avx(auVar84,auVar86,0x7f);
                fVar166 = auVar86._0_4_;
                auVar176._0_4_ = auVar84._0_4_ * fVar166;
                auVar176._4_4_ = auVar84._4_4_ * fVar166;
                auVar176._8_4_ = auVar84._8_4_ * fVar166;
                auVar176._12_4_ = auVar84._12_4_ * fVar166;
                auVar86 = vsubps_avx(auVar199,auVar176);
                fVar166 = auVar83._0_4_ * (float)local_730._0_4_;
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar135._16_16_ = local_800._16_16_;
                auVar89 = vxorps_avx512vl(auVar84,auVar22);
                auVar218._0_4_ = fVar238 * auVar86._0_4_ * fVar166;
                auVar218._4_4_ = fVar234 * auVar86._4_4_ * fVar166;
                auVar218._8_4_ = fVar230 * auVar86._8_4_ * fVar166;
                auVar218._12_4_ = fVar232 * auVar86._12_4_ * fVar166;
                auVar83 = vdpps_avx(auVar89,auVar150,0x7f);
                auVar86 = vmaxss_avx(ZEXT416((uint)fVar144),
                                     ZEXT416((uint)(fVar229 * fVar231 * 1.9073486e-06)));
                auVar90 = vdivss_avx512f(ZEXT416((uint)fVar144),auVar85);
                auVar85 = vdpps_avx(local_7c0._0_16_,auVar218,0x7f);
                auVar82 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar144),auVar86);
                auVar90 = vfmadd213ss_fma(ZEXT416((uint)(fVar206 + 1.0)),auVar90,auVar82);
                auVar82 = vdpps_avx(local_780,auVar150,0x7f);
                fVar238 = auVar83._0_4_ + auVar85._0_4_;
                auVar83 = vdpps_avx(local_7c0._0_16_,auVar89,0x7f);
                auVar88 = vmulss_avx512f(auVar88,auVar87);
                auVar87 = vmulss_avx512f(auVar87,auVar87);
                auVar85 = vdpps_avx(local_7c0._0_16_,local_780,0x7f);
                auVar88 = vaddss_avx512f(auVar81,ZEXT416((uint)(auVar88._0_4_ * auVar87._0_4_)));
                auVar87 = vfnmadd231ss_fma(auVar83,auVar80,ZEXT416((uint)fVar238));
                auVar81 = vfnmadd231ss_fma(auVar85,auVar80,auVar82);
                auVar83 = vpermilps_avx(local_640._0_16_,0xff);
                fVar233 = fVar233 - auVar83._0_4_;
                auVar83 = vshufps_avx(auVar84,auVar84,0xff);
                auVar85 = vfmsub213ss_fma(auVar87,auVar88,auVar83);
                fVar206 = auVar81._0_4_ * auVar88._0_4_;
                auVar87 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar85._0_4_)),
                                          ZEXT416((uint)fVar238),ZEXT416((uint)fVar206));
                fVar234 = auVar87._0_4_;
                fVar238 = fVar233 * (fVar238 / fVar234) - fVar165 * (auVar85._0_4_ / fVar234);
                auVar219 = ZEXT464((uint)fVar238);
                fVar228 = fVar228 - (fVar165 * (fVar206 / fVar234) -
                                    fVar233 * (auVar82._0_4_ / fVar234));
                fVar229 = fVar229 - fVar238;
                auVar82 = vandps_avx(auVar80,auVar237);
                if (auVar90._0_4_ <= auVar82._0_4_) {
LAB_01de40cf:
                  bVar5 = false;
                }
                else {
                  auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar90._0_4_ + auVar86._0_4_)),local_770
                                            ,ZEXT416(0x36000000));
                  auVar82 = vandps_avx(auVar237,ZEXT416((uint)fVar233));
                  if (auVar85._0_4_ <= auVar82._0_4_) goto LAB_01de40cf;
                  fVar229 = fVar229 + (float)local_760._0_4_;
                  bVar5 = true;
                  if (fVar207 <= fVar229) {
                    fVar238 = *(float *)(ray + k * 4 + 0x80);
                    auVar219 = ZEXT464((uint)fVar238);
                    if (((fVar229 <= fVar238) && (0.0 <= fVar228)) && (fVar228 <= 1.0)) {
                      auVar135._0_16_ = ZEXT816(0) << 0x20;
                      auVar134._4_28_ = auVar135._4_28_;
                      auVar134._0_4_ = local_7e0._0_4_;
                      auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar134._0_16_);
                      fVar165 = auVar82._0_4_;
                      auVar82 = vmulss_avx512f(local_7e0._0_16_,ZEXT416(0xbf000000));
                      pGVar3 = (context->scene->geometries).items[uVar76].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        fVar165 = fVar165 * 1.5 + auVar82._0_4_ * fVar165 * fVar165 * fVar165;
                        auVar177._0_4_ = local_7c0._0_4_ * fVar165;
                        auVar177._4_4_ = local_7c0._4_4_ * fVar165;
                        auVar177._8_4_ = local_7c0._8_4_ * fVar165;
                        auVar177._12_4_ = local_7c0._12_4_ * fVar165;
                        auVar85 = vfmadd213ps_fma(auVar83,auVar177,auVar84);
                        auVar82 = vshufps_avx(auVar177,auVar177,0xc9);
                        auVar83 = vshufps_avx(auVar84,auVar84,0xc9);
                        auVar178._0_4_ = auVar177._0_4_ * auVar83._0_4_;
                        auVar178._4_4_ = auVar177._4_4_ * auVar83._4_4_;
                        auVar178._8_4_ = auVar177._8_4_ * auVar83._8_4_;
                        auVar178._12_4_ = auVar177._12_4_ * auVar83._12_4_;
                        auVar84 = vfmsub231ps_fma(auVar178,auVar84,auVar82);
                        auVar82 = vshufps_avx(auVar84,auVar84,0xc9);
                        auVar83 = vshufps_avx(auVar85,auVar85,0xc9);
                        auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                        auVar152._0_4_ = auVar85._0_4_ * auVar84._0_4_;
                        auVar152._4_4_ = auVar85._4_4_ * auVar84._4_4_;
                        auVar152._8_4_ = auVar85._8_4_ * auVar84._8_4_;
                        auVar152._12_4_ = auVar85._12_4_ * auVar84._12_4_;
                        auVar82 = vfmsub231ps_fma(auVar152,auVar82,auVar83);
                        uVar208 = auVar82._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar229;
                          uVar2 = vextractps_avx(auVar82,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                          uVar2 = vextractps_avx(auVar82,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = uVar208;
                          *(float *)(ray + k * 4 + 0xf0) = fVar228;
                          *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                          *(int *)(ray + k * 4 + 0x110) = (int)local_8c0;
                          *(uint *)(ray + k * 4 + 0x120) = uVar76;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_5e0 = (RTCHitN  [16])vshufps_avx(auVar82,auVar82,0x55);
                          auStack_5d0 = vshufps_avx(auVar82,auVar82,0xaa);
                          local_5c0 = uVar208;
                          uStack_5bc = uVar208;
                          uStack_5b8 = uVar208;
                          uStack_5b4 = uVar208;
                          local_5b0 = fVar228;
                          fStack_5ac = fVar228;
                          fStack_5a8 = fVar228;
                          fStack_5a4 = fVar228;
                          local_5a0 = ZEXT416(0) << 0x20;
                          local_590 = local_600._0_8_;
                          uStack_588 = local_600._8_8_;
                          local_580 = local_5f0;
                          vpcmpeqd_avx2(ZEXT1632(local_5f0),ZEXT1632(local_5f0));
                          uStack_56c = context->user->instID[0];
                          local_570 = uStack_56c;
                          uStack_568 = uStack_56c;
                          uStack_564 = uStack_56c;
                          uStack_560 = context->user->instPrimID[0];
                          uStack_55c = uStack_560;
                          uStack_558 = uStack_560;
                          uStack_554 = uStack_560;
                          *(float *)(ray + k * 4 + 0x80) = fVar229;
                          local_8d0 = local_610._0_8_;
                          uStack_8c8 = local_610._8_8_;
                          local_860.valid = (int *)&local_8d0;
                          local_860.geometryUserPtr = pGVar3->userPtr;
                          local_860.context = context->user;
                          local_860.hit = local_5e0;
                          local_860.N = 4;
                          local_860.ray = (RTCRayN *)ray;
                          if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar3->intersectionFilterN)(&local_860);
                            auVar244 = ZEXT3264(local_800);
                            auVar246 = ZEXT3264(local_8a0);
                            auVar245 = ZEXT3264(local_880);
                          }
                          auVar61._8_8_ = uStack_8c8;
                          auVar61._0_8_ = local_8d0;
                          uVar79 = vptestmd_avx512vl(auVar61,auVar61);
                          if ((uVar79 & 0xf) == 0) {
LAB_01de436a:
                            *(float *)(ray + k * 4 + 0x80) = fVar238;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var4)(&local_860);
                              auVar244 = ZEXT3264(local_800);
                              auVar246 = ZEXT3264(local_8a0);
                              auVar245 = ZEXT3264(local_880);
                            }
                            auVar62._8_8_ = uStack_8c8;
                            auVar62._0_8_ = local_8d0;
                            uVar79 = vptestmd_avx512vl(auVar62,auVar62);
                            uVar79 = uVar79 & 0xf;
                            bVar71 = (byte)uVar79;
                            if (bVar71 == 0) goto LAB_01de436a;
                            iVar56 = *(int *)(local_860.hit + 4);
                            iVar57 = *(int *)(local_860.hit + 8);
                            iVar58 = *(int *)(local_860.hit + 0xc);
                            bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
                            bVar7 = SUB81(uVar79 >> 3,0);
                            *(uint *)(local_860.ray + 0xc0) =
                                 (uint)(bVar71 & 1) * *(int *)local_860.hit |
                                 (uint)!(bool)(bVar71 & 1) * *(int *)(local_860.ray + 0xc0);
                            *(uint *)(local_860.ray + 0xc4) =
                                 (uint)bVar78 * iVar56 |
                                 (uint)!bVar78 * *(int *)(local_860.ray + 0xc4);
                            *(uint *)(local_860.ray + 200) =
                                 (uint)bVar6 * iVar57 | (uint)!bVar6 * *(int *)(local_860.ray + 200)
                            ;
                            *(uint *)(local_860.ray + 0xcc) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xcc);
                            iVar56 = *(int *)(local_860.hit + 0x14);
                            iVar57 = *(int *)(local_860.hit + 0x18);
                            iVar58 = *(int *)(local_860.hit + 0x1c);
                            bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
                            bVar7 = SUB81(uVar79 >> 3,0);
                            *(uint *)(local_860.ray + 0xd0) =
                                 (uint)(bVar71 & 1) * *(int *)(local_860.hit + 0x10) |
                                 (uint)!(bool)(bVar71 & 1) * *(int *)(local_860.ray + 0xd0);
                            *(uint *)(local_860.ray + 0xd4) =
                                 (uint)bVar78 * iVar56 |
                                 (uint)!bVar78 * *(int *)(local_860.ray + 0xd4);
                            *(uint *)(local_860.ray + 0xd8) =
                                 (uint)bVar6 * iVar57 |
                                 (uint)!bVar6 * *(int *)(local_860.ray + 0xd8);
                            *(uint *)(local_860.ray + 0xdc) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xdc);
                            iVar56 = *(int *)(local_860.hit + 0x24);
                            iVar57 = *(int *)(local_860.hit + 0x28);
                            iVar58 = *(int *)(local_860.hit + 0x2c);
                            bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
                            bVar7 = SUB81(uVar79 >> 3,0);
                            *(uint *)(local_860.ray + 0xe0) =
                                 (uint)(bVar71 & 1) * *(int *)(local_860.hit + 0x20) |
                                 (uint)!(bool)(bVar71 & 1) * *(int *)(local_860.ray + 0xe0);
                            *(uint *)(local_860.ray + 0xe4) =
                                 (uint)bVar78 * iVar56 |
                                 (uint)!bVar78 * *(int *)(local_860.ray + 0xe4);
                            *(uint *)(local_860.ray + 0xe8) =
                                 (uint)bVar6 * iVar57 |
                                 (uint)!bVar6 * *(int *)(local_860.ray + 0xe8);
                            *(uint *)(local_860.ray + 0xec) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xec);
                            iVar56 = *(int *)(local_860.hit + 0x34);
                            iVar57 = *(int *)(local_860.hit + 0x38);
                            iVar58 = *(int *)(local_860.hit + 0x3c);
                            bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
                            bVar7 = SUB81(uVar79 >> 3,0);
                            *(uint *)(local_860.ray + 0xf0) =
                                 (uint)(bVar71 & 1) * *(int *)(local_860.hit + 0x30) |
                                 (uint)!(bool)(bVar71 & 1) * *(int *)(local_860.ray + 0xf0);
                            *(uint *)(local_860.ray + 0xf4) =
                                 (uint)bVar78 * iVar56 |
                                 (uint)!bVar78 * *(int *)(local_860.ray + 0xf4);
                            *(uint *)(local_860.ray + 0xf8) =
                                 (uint)bVar6 * iVar57 |
                                 (uint)!bVar6 * *(int *)(local_860.ray + 0xf8);
                            *(uint *)(local_860.ray + 0xfc) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0xfc);
                            iVar56 = *(int *)(local_860.hit + 0x44);
                            iVar57 = *(int *)(local_860.hit + 0x48);
                            iVar58 = *(int *)(local_860.hit + 0x4c);
                            bVar78 = (bool)((byte)(uVar79 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar79 >> 2) & 1);
                            bVar7 = SUB81(uVar79 >> 3,0);
                            *(uint *)(local_860.ray + 0x100) =
                                 (uint)(bVar71 & 1) * *(int *)(local_860.hit + 0x40) |
                                 (uint)!(bool)(bVar71 & 1) * *(int *)(local_860.ray + 0x100);
                            *(uint *)(local_860.ray + 0x104) =
                                 (uint)bVar78 * iVar56 |
                                 (uint)!bVar78 * *(int *)(local_860.ray + 0x104);
                            *(uint *)(local_860.ray + 0x108) =
                                 (uint)bVar6 * iVar57 |
                                 (uint)!bVar6 * *(int *)(local_860.ray + 0x108);
                            *(uint *)(local_860.ray + 0x10c) =
                                 (uint)bVar7 * iVar58 |
                                 (uint)!bVar7 * *(int *)(local_860.ray + 0x10c);
                            auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x50));
                            *(undefined1 (*) [16])(local_860.ray + 0x110) = auVar82;
                            auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x60));
                            *(undefined1 (*) [16])(local_860.ray + 0x120) = auVar82;
                            auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x70));
                            *(undefined1 (*) [16])(local_860.ray + 0x130) = auVar82;
                            auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_860.hit + 0x80));
                            *(undefined1 (*) [16])(local_860.ray + 0x140) = auVar82;
                          }
                          auVar219 = ZEXT464((uint)fVar238);
                        }
                      }
                    }
                  }
                }
                bVar78 = lVar77 != 0;
                lVar77 = lVar77 + -1;
              } while ((!bVar5) && (bVar78));
              auVar64._4_4_ = fStack_51c;
              auVar64._0_4_ = local_520;
              auVar64._8_4_ = fStack_518;
              auVar64._12_4_ = fStack_514;
              auVar64._16_4_ = fStack_510;
              auVar64._20_4_ = fStack_50c;
              auVar64._24_4_ = fStack_508;
              auVar64._28_4_ = fStack_504;
              uVar208 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar34._4_4_ = uVar208;
              auVar34._0_4_ = uVar208;
              auVar34._8_4_ = uVar208;
              auVar34._12_4_ = uVar208;
              auVar34._16_4_ = uVar208;
              auVar34._20_4_ = uVar208;
              auVar34._24_4_ = uVar208;
              auVar34._28_4_ = uVar208;
              uVar13 = vcmpps_avx512vl(auVar64,auVar34,2);
              bVar74 = ~('\x01' << ((byte)iVar16 & 0x1f)) & bVar74 & (byte)uVar13;
            } while (bVar74 != 0);
          }
          uVar14 = vpcmpd_avx512vl(local_4c0,_local_540,1);
          uVar15 = vpcmpd_avx512vl(local_4c0,local_440,1);
          auVar183._0_4_ = (float)local_660._0_4_ + (float)local_1c0._0_4_;
          auVar183._4_4_ = (float)local_660._4_4_ + (float)local_1c0._4_4_;
          auVar183._8_4_ = fStack_658 + fStack_1b8;
          auVar183._12_4_ = fStack_654 + fStack_1b4;
          auVar183._16_4_ = fStack_650 + fStack_1b0;
          auVar183._20_4_ = fStack_64c + fStack_1ac;
          auVar183._24_4_ = fStack_648 + fStack_1a8;
          auVar183._28_4_ = fStack_644 + fStack_1a4;
          uVar208 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar203._4_4_ = uVar208;
          auVar203._0_4_ = uVar208;
          auVar203._8_4_ = uVar208;
          auVar203._12_4_ = uVar208;
          auVar203._16_4_ = uVar208;
          auVar203._20_4_ = uVar208;
          auVar203._24_4_ = uVar208;
          auVar203._28_4_ = uVar208;
          uVar13 = vcmpps_avx512vl(auVar183,auVar203,2);
          bVar74 = (byte)local_8b0 & (byte)uVar15 & (byte)uVar13;
          auVar211._0_4_ = (float)local_660._0_4_ + (float)local_480._0_4_;
          auVar211._4_4_ = (float)local_660._4_4_ + (float)local_480._4_4_;
          auVar211._8_4_ = fStack_658 + fStack_478;
          auVar211._12_4_ = fStack_654 + fStack_474;
          auVar211._16_4_ = fStack_650 + fStack_470;
          auVar211._20_4_ = fStack_64c + fStack_46c;
          auVar211._24_4_ = fStack_648 + fStack_468;
          auVar211._28_4_ = fStack_644 + fStack_464;
          uVar13 = vcmpps_avx512vl(auVar211,auVar203,2);
          bVar69 = bVar69 & (byte)uVar14 & (byte)uVar13 | bVar74;
          prim = local_820;
          if (bVar69 == 0) {
            auVar212 = ZEXT3264(_DAT_02020f20);
          }
          else {
            uVar79 = local_810 & 0xffffffff;
            abStack_180[uVar79 * 0x60] = bVar69;
            bVar5 = (bool)(bVar74 >> 1 & 1);
            bVar78 = (bool)(bVar74 >> 2 & 1);
            bVar6 = (bool)(bVar74 >> 3 & 1);
            bVar7 = (bool)(bVar74 >> 4 & 1);
            bVar8 = (bool)(bVar74 >> 5 & 1);
            bVar9 = (bool)(bVar74 >> 6 & 1);
            auStack_160[uVar79 * 0x18] =
                 (uint)(bVar74 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar74 & 1) * local_480._0_4_;
            auStack_160[uVar79 * 0x18 + 1] =
                 (uint)bVar5 * local_1c0._4_4_ | (uint)!bVar5 * local_480._4_4_;
            auStack_160[uVar79 * 0x18 + 2] =
                 (uint)bVar78 * (int)fStack_1b8 | (uint)!bVar78 * (int)fStack_478;
            auStack_160[uVar79 * 0x18 + 3] =
                 (uint)bVar6 * (int)fStack_1b4 | (uint)!bVar6 * (int)fStack_474;
            auStack_160[uVar79 * 0x18 + 4] =
                 (uint)bVar7 * (int)fStack_1b0 | (uint)!bVar7 * (int)fStack_470;
            afStack_140[uVar79 * 0x18 + -3] =
                 (float)((uint)bVar8 * (int)fStack_1ac | (uint)!bVar8 * (int)fStack_46c);
            afStack_140[uVar79 * 0x18 + -2] =
                 (float)((uint)bVar9 * (int)fStack_1a8 | (uint)!bVar9 * (int)fStack_468);
            afStack_140[uVar79 * 0x18 + -1] =
                 (float)((uint)(bVar74 >> 7) * (int)fStack_1a4 |
                        (uint)!(bool)(bVar74 >> 7) * (int)fStack_464);
            uVar13 = vmovlps_avx(local_830);
            *(undefined8 *)(afStack_140 + uVar79 * 0x18) = uVar13;
            auStack_138[uVar79 * 0x18] = (int)local_818 + 1;
            local_810 = (ulong)((int)local_810 + 1);
            auVar212 = ZEXT3264(_DAT_02020f20);
          }
        }
      }
    }
    auVar204 = ZEXT1664(local_830);
    local_810 = local_810 & 0xffffffff;
    do {
      if ((int)local_810 == 0) {
        uVar208 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar36._4_4_ = uVar208;
        auVar36._0_4_ = uVar208;
        auVar36._8_4_ = uVar208;
        auVar36._12_4_ = uVar208;
        auVar36._16_4_ = uVar208;
        auVar36._20_4_ = uVar208;
        auVar36._24_4_ = uVar208;
        auVar36._28_4_ = uVar208;
        uVar13 = vcmpps_avx512vl(local_420,auVar36,2);
        uVar76 = (uint)local_808 & (uint)uVar13;
        local_808 = (ulong)uVar76;
        if (uVar76 == 0) {
          return;
        }
        goto LAB_01de1f99;
      }
      uVar79 = (ulong)((int)local_810 - 1);
      auVar96 = *(undefined1 (*) [32])(auStack_160 + uVar79 * 0x18);
      auVar184._0_4_ = auVar96._0_4_ + (float)local_660._0_4_;
      auVar184._4_4_ = auVar96._4_4_ + (float)local_660._4_4_;
      auVar184._8_4_ = auVar96._8_4_ + fStack_658;
      auVar184._12_4_ = auVar96._12_4_ + fStack_654;
      auVar184._16_4_ = auVar96._16_4_ + fStack_650;
      auVar184._20_4_ = auVar96._20_4_ + fStack_64c;
      auVar184._24_4_ = auVar96._24_4_ + fStack_648;
      auVar184._28_4_ = auVar96._28_4_ + fStack_644;
      uVar208 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar35._4_4_ = uVar208;
      auVar35._0_4_ = uVar208;
      auVar35._8_4_ = uVar208;
      auVar35._12_4_ = uVar208;
      auVar35._16_4_ = uVar208;
      auVar35._20_4_ = uVar208;
      auVar35._24_4_ = uVar208;
      auVar35._28_4_ = uVar208;
      uVar13 = vcmpps_avx512vl(auVar184,auVar35,2);
      uVar73 = (uint)uVar13 & (uint)abStack_180[uVar79 * 0x60];
      bVar69 = (byte)uVar73;
      if (uVar73 != 0) {
        auVar185._8_4_ = 0x7f800000;
        auVar185._0_8_ = 0x7f8000007f800000;
        auVar185._12_4_ = 0x7f800000;
        auVar185._16_4_ = 0x7f800000;
        auVar185._20_4_ = 0x7f800000;
        auVar185._24_4_ = 0x7f800000;
        auVar185._28_4_ = 0x7f800000;
        auVar94 = vblendmps_avx512vl(auVar185,auVar96);
        auVar136._0_4_ =
             (uint)(bVar69 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar69 & 1) * (int)auVar96._0_4_;
        bVar5 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar5 * auVar94._4_4_ | (uint)!bVar5 * (int)auVar96._4_4_;
        bVar5 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar5 * auVar94._8_4_ | (uint)!bVar5 * (int)auVar96._8_4_;
        bVar5 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar5 * auVar94._12_4_ | (uint)!bVar5 * (int)auVar96._12_4_;
        bVar5 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar136._16_4_ = (uint)bVar5 * auVar94._16_4_ | (uint)!bVar5 * (int)auVar96._16_4_;
        bVar5 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar136._20_4_ = (uint)bVar5 * auVar94._20_4_ | (uint)!bVar5 * (int)auVar96._20_4_;
        bVar5 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar136._24_4_ = (uint)bVar5 * auVar94._24_4_ | (uint)!bVar5 * (int)auVar96._24_4_;
        auVar136._28_4_ =
             (uVar73 >> 7) * auVar94._28_4_ | (uint)!SUB41(uVar73 >> 7,0) * (int)auVar96._28_4_;
        auVar96 = vshufps_avx(auVar136,auVar136,0xb1);
        auVar96 = vminps_avx(auVar136,auVar96);
        auVar94 = vshufpd_avx(auVar96,auVar96,5);
        auVar96 = vminps_avx(auVar96,auVar94);
        auVar94 = vpermpd_avx2(auVar96,0x4e);
        auVar96 = vminps_avx(auVar96,auVar94);
        uVar13 = vcmpps_avx512vl(auVar136,auVar96,0);
        bVar74 = (byte)uVar13 & bVar69;
        if (bVar74 != 0) {
          uVar73 = (uint)bVar74;
        }
        fVar144 = afStack_140[uVar79 * 0x18 + 1];
        uVar137 = 0;
        for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
          uVar137 = uVar137 + 1;
        }
        local_818 = (ulong)auStack_138[uVar79 * 0x18];
        bVar74 = ~('\x01' << ((byte)uVar137 & 0x1f)) & bVar69;
        abStack_180[uVar79 * 0x60] = bVar74;
        uVar75 = uVar79;
        if (bVar74 != 0) {
          uVar75 = local_810;
        }
        fVar228 = afStack_140[uVar79 * 0x18];
        auVar186._4_4_ = fVar228;
        auVar186._0_4_ = fVar228;
        auVar186._8_4_ = fVar228;
        auVar186._12_4_ = fVar228;
        auVar186._16_4_ = fVar228;
        auVar186._20_4_ = fVar228;
        auVar186._24_4_ = fVar228;
        auVar186._28_4_ = fVar228;
        fVar144 = fVar144 - fVar228;
        auVar164._4_4_ = fVar144;
        auVar164._0_4_ = fVar144;
        auVar164._8_4_ = fVar144;
        auVar164._12_4_ = fVar144;
        auVar164._16_4_ = fVar144;
        auVar164._20_4_ = fVar144;
        auVar164._24_4_ = fVar144;
        auVar164._28_4_ = fVar144;
        auVar82 = vfmadd132ps_fma(auVar164,auVar186,auVar212._0_32_);
        _local_5e0 = ZEXT1632(auVar82);
        auVar204 = ZEXT864(*(ulong *)(local_5e0 + (ulong)uVar137 * 4));
        uVar79 = uVar75;
      }
      local_810 = uVar79;
    } while (bVar69 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }